

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  int iVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  Geometry *pGVar68;
  byte bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  long lVar73;
  long lVar74;
  Geometry *pGVar75;
  uint uVar76;
  ulong uVar77;
  byte bVar78;
  ulong uVar79;
  ulong uVar80;
  float fVar81;
  float fVar132;
  float fVar134;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar82;
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar136;
  float fVar139;
  float fVar140;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar141;
  float fVar158;
  float fVar159;
  vint4 bi_2;
  undefined1 auVar142 [16];
  float fVar160;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined8 uVar161;
  vint4 bi_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar168;
  float fVar180;
  vint4 bi;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  vint4 ai_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [64];
  vint4 ai;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar221 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5f0 [16];
  Precalculations *local_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_588;
  Geometry *local_558;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  LinearSpace3fa *local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  int local_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar222 [32];
  
  PVar6 = prim[1];
  uVar70 = (ulong)(byte)PVar6;
  lVar26 = uVar70 * 0x25;
  fVar168 = *(float *)(prim + lVar26 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar83 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + lVar26 + 6));
  auVar181._0_4_ = fVar168 * auVar83._0_4_;
  auVar181._4_4_ = fVar168 * auVar83._4_4_;
  auVar181._8_4_ = fVar168 * auVar83._8_4_;
  auVar181._12_4_ = fVar168 * auVar83._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar142._0_4_ = fVar168 * auVar84._0_4_;
  auVar142._4_4_ = fVar168 * auVar84._4_4_;
  auVar142._8_4_ = fVar168 * auVar84._8_4_;
  auVar142._12_4_ = fVar168 * auVar84._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar70 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar202._4_4_ = auVar142._0_4_;
  auVar202._0_4_ = auVar142._0_4_;
  auVar202._8_4_ = auVar142._0_4_;
  auVar202._12_4_ = auVar142._0_4_;
  auVar89 = vshufps_avx(auVar142,auVar142,0x55);
  auVar226 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar168 = auVar226._0_4_;
  auVar169._0_4_ = fVar168 * auVar88._0_4_;
  fVar158 = auVar226._4_4_;
  auVar169._4_4_ = fVar158 * auVar88._4_4_;
  fVar159 = auVar226._8_4_;
  auVar169._8_4_ = fVar159 * auVar88._8_4_;
  fVar160 = auVar226._12_4_;
  auVar169._12_4_ = fVar160 * auVar88._12_4_;
  auVar162._0_4_ = auVar21._0_4_ * fVar168;
  auVar162._4_4_ = auVar21._4_4_ * fVar158;
  auVar162._8_4_ = auVar21._8_4_ * fVar159;
  auVar162._12_4_ = auVar21._12_4_ * fVar160;
  auVar143._0_4_ = auVar24._0_4_ * fVar168;
  auVar143._4_4_ = auVar24._4_4_ * fVar158;
  auVar143._8_4_ = auVar24._8_4_ * fVar159;
  auVar143._12_4_ = auVar24._12_4_ * fVar160;
  auVar226 = vfmadd231ps_fma(auVar169,auVar89,auVar84);
  auVar28 = vfmadd231ps_fma(auVar162,auVar89,auVar20);
  auVar89 = vfmadd231ps_fma(auVar143,auVar23,auVar89);
  auVar90 = vfmadd231ps_fma(auVar226,auVar202,auVar83);
  auVar28 = vfmadd231ps_fma(auVar28,auVar202,auVar19);
  auVar91 = vfmadd231ps_fma(auVar89,auVar22,auVar202);
  auVar219._4_4_ = auVar181._0_4_;
  auVar219._0_4_ = auVar181._0_4_;
  auVar219._8_4_ = auVar181._0_4_;
  auVar219._12_4_ = auVar181._0_4_;
  auVar89 = vshufps_avx(auVar181,auVar181,0x55);
  auVar226 = vshufps_avx(auVar181,auVar181,0xaa);
  fVar168 = auVar226._0_4_;
  auVar203._0_4_ = fVar168 * auVar88._0_4_;
  fVar158 = auVar226._4_4_;
  auVar203._4_4_ = fVar158 * auVar88._4_4_;
  fVar159 = auVar226._8_4_;
  auVar203._8_4_ = fVar159 * auVar88._8_4_;
  fVar160 = auVar226._12_4_;
  auVar203._12_4_ = fVar160 * auVar88._12_4_;
  auVar187._0_4_ = auVar21._0_4_ * fVar168;
  auVar187._4_4_ = auVar21._4_4_ * fVar158;
  auVar187._8_4_ = auVar21._8_4_ * fVar159;
  auVar187._12_4_ = auVar21._12_4_ * fVar160;
  auVar182._0_4_ = auVar24._0_4_ * fVar168;
  auVar182._4_4_ = auVar24._4_4_ * fVar158;
  auVar182._8_4_ = auVar24._8_4_ * fVar159;
  auVar182._12_4_ = auVar24._12_4_ * fVar160;
  auVar84 = vfmadd231ps_fma(auVar203,auVar89,auVar84);
  auVar88 = vfmadd231ps_fma(auVar187,auVar89,auVar20);
  auVar20 = vfmadd231ps_fma(auVar182,auVar89,auVar23);
  auVar29 = vfmadd231ps_fma(auVar84,auVar219,auVar83);
  auVar142 = vfmadd231ps_fma(auVar88,auVar219,auVar19);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar83);
  auVar143 = vfmadd231ps_fma(auVar20,auVar219,auVar22);
  auVar84 = vandps_avx512vl(auVar90,auVar83);
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar84,auVar208,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar85._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._12_4_;
  auVar84 = vandps_avx512vl(auVar28,auVar83);
  uVar77 = vcmpps_avx512vl(auVar84,auVar208,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar86._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._12_4_;
  auVar83 = vandps_avx512vl(auVar91,auVar83);
  uVar77 = vcmpps_avx512vl(auVar83,auVar208,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar87._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._12_4_;
  auVar84 = vrcp14ps_avx512vl(auVar85);
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = 0x3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar85,auVar84,auVar209);
  auVar90 = vfmadd132ps_fma(auVar83,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar86);
  auVar83 = vfnmadd213ps_fma(auVar86,auVar84,auVar209);
  auVar91 = vfmadd132ps_fma(auVar83,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar87);
  auVar83 = vfnmadd213ps_fma(auVar87,auVar84,auVar209);
  auVar27 = vfmadd132ps_fma(auVar83,auVar84,auVar84);
  fVar168 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar206._4_4_ = fVar168;
  auVar206._0_4_ = fVar168;
  auVar206._8_4_ = fVar168;
  auVar206._12_4_ = fVar168;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar19 = vsubps_avx(auVar84,auVar83);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar84 = vpmovsxwd_avx(auVar88);
  auVar88 = vfmadd213ps_fma(auVar19,auVar206,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar84);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar84 = vpmovsxwd_avx(auVar19);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar19 = vfmadd213ps_fma(auVar84,auVar206,auVar83);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar83 = vpmovsxwd_avx(auVar20);
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar77 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar77 + 6);
  auVar84 = vpmovsxwd_avx(auVar21);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar20 = vfmadd213ps_fma(auVar84,auVar206,auVar83);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar83 = vpmovsxwd_avx(auVar22);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar23);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar21 = vfmadd213ps_fma(auVar84,auVar206,auVar83);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar83 = vpmovsxwd_avx(auVar24);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar84 = vpmovsxwd_avx(auVar89);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar22 = vfmadd213ps_fma(auVar84,auVar206,auVar83);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar70) + 6);
  auVar83 = vpmovsxwd_avx(auVar226);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar28);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar84 = vfmadd213ps_fma(auVar84,auVar206,auVar83);
  auVar83 = vsubps_avx(auVar88,auVar29);
  auVar207._0_4_ = auVar90._0_4_ * auVar83._0_4_;
  auVar207._4_4_ = auVar90._4_4_ * auVar83._4_4_;
  auVar207._8_4_ = auVar90._8_4_ * auVar83._8_4_;
  auVar207._12_4_ = auVar90._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar19,auVar29);
  auVar170._0_4_ = auVar90._0_4_ * auVar83._0_4_;
  auVar170._4_4_ = auVar90._4_4_ * auVar83._4_4_;
  auVar170._8_4_ = auVar90._8_4_ * auVar83._8_4_;
  auVar170._12_4_ = auVar90._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar20,auVar142);
  auVar204._0_4_ = auVar91._0_4_ * auVar83._0_4_;
  auVar204._4_4_ = auVar91._4_4_ * auVar83._4_4_;
  auVar204._8_4_ = auVar91._8_4_ * auVar83._8_4_;
  auVar204._12_4_ = auVar91._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar21,auVar142);
  auVar163._0_4_ = auVar91._0_4_ * auVar83._0_4_;
  auVar163._4_4_ = auVar91._4_4_ * auVar83._4_4_;
  auVar163._8_4_ = auVar91._8_4_ * auVar83._8_4_;
  auVar163._12_4_ = auVar91._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar22,auVar143);
  auVar188._0_4_ = auVar27._0_4_ * auVar83._0_4_;
  auVar188._4_4_ = auVar27._4_4_ * auVar83._4_4_;
  auVar188._8_4_ = auVar27._8_4_ * auVar83._8_4_;
  auVar188._12_4_ = auVar27._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar84,auVar143);
  auVar144._0_4_ = auVar27._0_4_ * auVar83._0_4_;
  auVar144._4_4_ = auVar27._4_4_ * auVar83._4_4_;
  auVar144._8_4_ = auVar27._8_4_ * auVar83._8_4_;
  auVar144._12_4_ = auVar27._12_4_ * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar207,auVar170);
  auVar84 = vpminsd_avx(auVar204,auVar163);
  auVar83 = vmaxps_avx(auVar83,auVar84);
  auVar84 = vpminsd_avx(auVar188,auVar144);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar90._4_4_ = uVar141;
  auVar90._0_4_ = uVar141;
  auVar90._8_4_ = uVar141;
  auVar90._12_4_ = uVar141;
  auVar84 = vmaxps_avx512vl(auVar84,auVar90);
  auVar83 = vmaxps_avx(auVar83,auVar84);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar83,auVar91);
  auVar83 = vpmaxsd_avx(auVar207,auVar170);
  auVar84 = vpmaxsd_avx(auVar204,auVar163);
  auVar83 = vminps_avx(auVar83,auVar84);
  auVar84 = vpmaxsd_avx(auVar188,auVar144);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar27._4_4_ = uVar141;
  auVar27._0_4_ = uVar141;
  auVar27._8_4_ = uVar141;
  auVar27._12_4_ = uVar141;
  auVar84 = vminps_avx512vl(auVar84,auVar27);
  auVar83 = vminps_avx(auVar83,auVar84);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar29);
  auVar84 = vpbroadcastd_avx512vl();
  uVar161 = vcmpps_avx512vl(local_190,auVar83,2);
  uVar77 = vpcmpgtd_avx512vl(auVar84,_DAT_01f7fcf0);
  uVar77 = ((byte)uVar161 & 0xf) & uVar77;
  if ((char)uVar77 != '\0') {
    local_528 = pre->ray_space + k;
    local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar228 = ZEXT464(0xbf800000);
    local_5d8 = pre;
    do {
      lVar26 = 0;
      for (uVar70 = uVar77; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar76 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar26 * 4 + 6);
      pGVar75 = (context->scene->geometries).items[uVar76].ptr;
      uVar70 = (ulong)*(uint *)(*(long *)&pGVar75->field_0x58 +
                               (ulong)uVar7 *
                               pGVar75[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar168 = (pGVar75->time_range).lower;
      fVar168 = pGVar75->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar168) /
                ((pGVar75->time_range).upper - fVar168));
      auVar83 = vroundss_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),9);
      auVar84 = vaddss_avx512f(ZEXT416((uint)pGVar75->fnumTimeSegments),auVar228._0_16_);
      auVar83 = vminss_avx(auVar83,auVar84);
      auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
      fVar168 = fVar168 - auVar83._0_4_;
      _Var10 = pGVar75[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar74 = (long)(int)auVar83._0_4_ * 0x38;
      lVar26 = *(long *)(_Var10 + 0x10 + lVar74);
      lVar73 = *(long *)(_Var10 + 0x38 + lVar74);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar74);
      auVar164._4_4_ = fVar168;
      auVar164._0_4_ = fVar168;
      auVar164._8_4_ = fVar168;
      auVar164._12_4_ = fVar168;
      pfVar3 = (float *)(lVar73 + uVar70 * lVar11);
      auVar212._0_4_ = fVar168 * *pfVar3;
      auVar212._4_4_ = fVar168 * pfVar3[1];
      auVar212._8_4_ = fVar168 * pfVar3[2];
      auVar212._12_4_ = fVar168 * pfVar3[3];
      pfVar3 = (float *)(lVar73 + (uVar70 + 1) * lVar11);
      auVar213._0_4_ = fVar168 * *pfVar3;
      auVar213._4_4_ = fVar168 * pfVar3[1];
      auVar213._8_4_ = fVar168 * pfVar3[2];
      auVar213._12_4_ = fVar168 * pfVar3[3];
      auVar83 = vmulps_avx512vl(auVar164,*(undefined1 (*) [16])(lVar73 + (uVar70 + 2) * lVar11));
      auVar84 = vmulps_avx512vl(auVar164,*(undefined1 (*) [16])(lVar73 + lVar11 * (uVar70 + 3)));
      lVar73 = *(long *)(_Var10 + lVar74);
      fVar168 = 1.0 - fVar168;
      auVar145._4_4_ = fVar168;
      auVar145._0_4_ = fVar168;
      auVar145._8_4_ = fVar168;
      auVar145._12_4_ = fVar168;
      local_5a0 = vfmadd231ps_fma(auVar212,auVar145,*(undefined1 (*) [16])(lVar73 + lVar26 * uVar70)
                                 );
      local_5b0 = vfmadd231ps_fma(auVar213,auVar145,
                                  *(undefined1 (*) [16])(lVar73 + lVar26 * (uVar70 + 1)));
      local_5c0 = vfmadd231ps_avx512vl
                            (auVar83,auVar145,*(undefined1 (*) [16])(lVar73 + lVar26 * (uVar70 + 2))
                            );
      _local_5d0 = vfmadd231ps_avx512vl
                             (auVar84,auVar145,
                              *(undefined1 (*) [16])(lVar73 + lVar26 * (uVar70 + 3)));
      iVar8 = (int)pGVar75[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar26 = (long)iVar8 * 0x44;
      auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar88 = vsubps_avx(local_5a0,auVar83);
      uVar141 = auVar88._0_4_;
      auVar171._4_4_ = uVar141;
      auVar171._0_4_ = uVar141;
      auVar171._8_4_ = uVar141;
      auVar171._12_4_ = uVar141;
      auVar84 = vshufps_avx(auVar88,auVar88,0x55);
      aVar4 = (local_528->vx).field_0;
      aVar5 = (local_528->vy).field_0;
      fVar168 = (local_528->vz).field_0.m128[0];
      fVar158 = *(float *)((long)&(local_528->vz).field_0 + 4);
      fVar159 = *(float *)((long)&(local_528->vz).field_0 + 8);
      fVar160 = *(float *)((long)&(local_528->vz).field_0 + 0xc);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar216._0_4_ = fVar168 * auVar88._0_4_;
      auVar216._4_4_ = fVar158 * auVar88._4_4_;
      auVar216._8_4_ = fVar159 * auVar88._8_4_;
      auVar216._12_4_ = fVar160 * auVar88._12_4_;
      auVar84 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar84);
      auVar19 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar171);
      auVar88 = vsubps_avx(local_5b0,auVar83);
      uVar141 = auVar88._0_4_;
      auVar172._4_4_ = uVar141;
      auVar172._0_4_ = uVar141;
      auVar172._8_4_ = uVar141;
      auVar172._12_4_ = uVar141;
      auVar84 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar217._0_4_ = fVar168 * auVar88._0_4_;
      auVar217._4_4_ = fVar158 * auVar88._4_4_;
      auVar217._8_4_ = fVar159 * auVar88._8_4_;
      auVar217._12_4_ = fVar160 * auVar88._12_4_;
      auVar84 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar84);
      auVar20 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar172);
      auVar88 = vsubps_avx512vl(local_5c0,auVar83);
      uVar141 = auVar88._0_4_;
      auVar173._4_4_ = uVar141;
      auVar173._0_4_ = uVar141;
      auVar173._8_4_ = uVar141;
      auVar173._12_4_ = uVar141;
      auVar84 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar218._0_4_ = fVar168 * auVar88._0_4_;
      auVar218._4_4_ = fVar158 * auVar88._4_4_;
      auVar218._8_4_ = fVar159 * auVar88._8_4_;
      auVar218._12_4_ = fVar160 * auVar88._12_4_;
      auVar84 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar84);
      auVar88 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar173);
      auVar84 = vsubps_avx512vl(_local_5d0,auVar83);
      uVar141 = auVar84._0_4_;
      auVar165._4_4_ = uVar141;
      auVar165._0_4_ = uVar141;
      auVar165._8_4_ = uVar141;
      auVar165._12_4_ = uVar141;
      auVar83 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar220._0_4_ = fVar168 * auVar84._0_4_;
      auVar220._4_4_ = fVar158 * auVar84._4_4_;
      auVar220._8_4_ = fVar159 * auVar84._8_4_;
      auVar220._12_4_ = fVar160 * auVar84._12_4_;
      auVar83 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar83);
      auVar21 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar165);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar26);
      uVar141 = auVar19._0_4_;
      local_2e0._4_4_ = uVar141;
      local_2e0._0_4_ = uVar141;
      local_2e0._8_4_ = uVar141;
      local_2e0._12_4_ = uVar141;
      local_2e0._16_4_ = uVar141;
      local_2e0._20_4_ = uVar141;
      local_2e0._24_4_ = uVar141;
      local_2e0._28_4_ = uVar141;
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x484);
      auVar92._8_4_ = 1;
      auVar92._0_8_ = 0x100000001;
      auVar92._12_4_ = 1;
      auVar92._16_4_ = 1;
      auVar92._20_4_ = 1;
      auVar92._24_4_ = 1;
      auVar92._28_4_ = 1;
      local_300 = vpermps_avx2(auVar92,ZEXT1632(auVar19));
      uVar141 = auVar20._0_4_;
      auVar183._4_4_ = uVar141;
      auVar183._0_4_ = uVar141;
      auVar183._8_4_ = uVar141;
      auVar183._12_4_ = uVar141;
      local_320._16_4_ = uVar141;
      local_320._0_16_ = auVar183;
      local_320._20_4_ = uVar141;
      local_320._24_4_ = uVar141;
      local_320._28_4_ = uVar141;
      local_340 = vpermps_avx512vl(auVar92,ZEXT1632(auVar20));
      auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar88);
      local_380 = vpermps_avx512vl(auVar92,ZEXT1632(auVar88));
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0xd8c);
      uVar141 = auVar21._0_4_;
      local_3a0._4_4_ = uVar141;
      local_3a0._0_4_ = uVar141;
      fStack_398 = (float)uVar141;
      fStack_394 = (float)uVar141;
      fStack_390 = (float)uVar141;
      fStack_38c = (float)uVar141;
      fStack_388 = (float)uVar141;
      register0x0000139c = uVar141;
      _local_3c0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar21));
      auVar92 = vmulps_avx512vl(_local_3a0,auVar104);
      auVar93 = vmulps_avx512vl(_local_3c0,auVar104);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_360);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar105,local_380);
      auVar83 = vfmadd231ps_fma(auVar92,auVar107,local_320);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar107,local_340);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar106,local_2e0);
      auVar205 = ZEXT3264(auVar95);
      auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar26);
      auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x484);
      auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x908);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar106,local_300);
      auVar201 = ZEXT3264(auVar96);
      auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0xd8c);
      auVar97 = vmulps_avx512vl(_local_3a0,auVar94);
      auVar98 = vmulps_avx512vl(_local_3c0,auVar94);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_360);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_380);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_340);
      auVar22 = vfmadd231ps_fma(auVar97,auVar92,local_2e0);
      auVar210 = ZEXT1664(auVar22);
      auVar23 = vfmadd231ps_fma(auVar98,auVar92,local_300);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar22),auVar95);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar23),auVar96);
      auVar97 = vmulps_avx512vl(auVar96,auVar98);
      auVar100 = vmulps_avx512vl(auVar95,auVar99);
      auVar97 = vsubps_avx512vl(auVar97,auVar100);
      auVar83 = vshufps_avx(local_5a0,local_5a0,0xff);
      uVar161 = auVar83._0_8_;
      local_80._8_8_ = uVar161;
      local_80._0_8_ = uVar161;
      local_80._16_8_ = uVar161;
      local_80._24_8_ = uVar161;
      auVar83 = vshufps_avx(local_5b0,local_5b0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar83);
      auVar83 = vshufps_avx512vl(local_5c0,local_5c0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar83);
      auVar83 = vshufps_avx512vl(_local_5d0,_local_5d0,0xff);
      uVar161 = auVar83._0_8_;
      local_e0._8_8_ = uVar161;
      local_e0._0_8_ = uVar161;
      local_e0._16_8_ = uVar161;
      local_e0._24_8_ = uVar161;
      auVar100 = vmulps_avx512vl(local_e0,auVar104);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_a0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_80);
      auVar101 = vmulps_avx512vl(local_e0,auVar94);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_a0);
      auVar24 = vfmadd231ps_fma(auVar101,auVar92,local_80);
      auVar101 = vmulps_avx512vl(auVar99,auVar99);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
      auVar102 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar24));
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      auVar101 = vmulps_avx512vl(auVar102,auVar101);
      auVar97 = vmulps_avx512vl(auVar97,auVar97);
      uVar161 = vcmpps_avx512vl(auVar97,auVar101,2);
      auVar83 = vblendps_avx(auVar19,local_5a0,8);
      auVar226 = auVar227._0_16_;
      auVar84 = vandps_avx512vl(auVar83,auVar226);
      auVar83 = vblendps_avx(auVar20,local_5b0,8);
      auVar83 = vandps_avx512vl(auVar83,auVar226);
      auVar84 = vmaxps_avx(auVar84,auVar83);
      auVar83 = vblendps_avx(auVar88,local_5c0,8);
      auVar89 = vandps_avx512vl(auVar83,auVar226);
      auVar83 = vblendps_avx(auVar21,_local_5d0,8);
      auVar83 = vandps_avx512vl(auVar83,auVar226);
      auVar83 = vmaxps_avx(auVar89,auVar83);
      auVar83 = vmaxps_avx(auVar84,auVar83);
      auVar84 = vmovshdup_avx(auVar83);
      auVar84 = vmaxss_avx(auVar84,auVar83);
      auVar83 = vshufpd_avx(auVar83,auVar83,1);
      auVar83 = vmaxss_avx(auVar83,auVar84);
      local_550 = vcvtsi2ss_avx512f(auVar226,iVar8);
      auVar102._0_4_ = local_550._0_4_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar102._16_4_ = auVar102._0_4_;
      auVar102._20_4_ = auVar102._0_4_;
      auVar102._24_4_ = auVar102._0_4_;
      auVar102._28_4_ = auVar102._0_4_;
      uVar25 = vcmpps_avx512vl(auVar102,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar161 & (byte)uVar25;
      auVar83 = vmulss_avx512f(auVar83,SUB6416(ZEXT464(0x35000000),0));
      local_500._0_16_ = auVar83;
      auVar97 = local_500;
      auVar101._8_4_ = 2;
      auVar101._0_8_ = 0x200000002;
      auVar101._12_4_ = 2;
      auVar101._16_4_ = 2;
      auVar101._20_4_ = 2;
      auVar101._24_4_ = 2;
      auVar101._28_4_ = 2;
      local_120 = vpermps_avx2(auVar101,ZEXT1632(auVar19));
      local_140 = vpermps_avx2(auVar101,ZEXT1632(auVar20));
      local_160 = vpermps_avx2(auVar101,ZEXT1632(auVar88));
      local_180 = vpermps_avx2(auVar101,ZEXT1632(auVar21));
      local_4a0 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_49c = 0;
      uStack_498 = 0;
      uStack_494 = 0;
      local_500 = auVar97;
      if (bVar78 != 0) {
        auVar94 = vmulps_avx512vl(local_180,auVar94);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar94);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar103);
        auVar94 = vfmadd213ps_avx512vl(auVar92,local_120,auVar93);
        auVar104 = vmulps_avx512vl(local_180,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_160,auVar104);
        auVar93 = vfmadd213ps_avx512vl(auVar107,local_140,auVar105);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1694);
        auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1f9c);
        auVar97 = vfmadd213ps_avx512vl(auVar106,local_120,auVar93);
        auVar106 = vmulps_avx512vl(_local_3a0,auVar92);
        auVar93 = vmulps_avx512vl(_local_3c0,auVar92);
        auVar92 = vmulps_avx512vl(local_180,auVar92);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,local_360);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_380);
        auVar104 = vfmadd231ps_avx512vl(auVar92,local_160,auVar104);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_320);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar105,local_340);
        auVar93 = vfmadd231ps_avx512vl(auVar104,local_140,auVar105);
        auVar84 = vfmadd231ps_fma(auVar106,auVar107,local_2e0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,local_300);
        auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1210);
        auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1f9c);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_120,auVar107);
        auVar107 = vmulps_avx512vl(_local_3a0,auVar104);
        auVar103 = vmulps_avx512vl(_local_3c0,auVar104);
        auVar104 = vmulps_avx512vl(local_180,auVar104);
        auVar101 = vfmadd231ps_avx512vl(auVar107,auVar105,local_360);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_380);
        auVar105 = vfmadd231ps_avx512vl(auVar104,local_160,auVar105);
        auVar227 = ZEXT1664(auVar226);
        auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1694);
        auVar104 = vfmadd231ps_avx512vl(auVar101,auVar107,local_320);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_340);
        auVar107 = vfmadd231ps_avx512vl(auVar105,local_140,auVar107);
        auVar228 = ZEXT1664(auVar228._0_16_);
        auVar88 = vfmadd231ps_fma(auVar104,auVar106,local_2e0);
        auVar105 = vfmadd231ps_avx512vl(auVar103,auVar106,local_300);
        auVar104 = vfmadd231ps_avx512vl(auVar107,local_120,auVar106);
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(ZEXT1632(auVar84),auVar221);
        auVar107 = vandps_avx(auVar92,auVar221);
        auVar107 = vmaxps_avx(auVar106,auVar107);
        auVar106 = vandps_avx(auVar93,auVar221);
        auVar106 = vmaxps_avx(auVar107,auVar106);
        local_500._0_4_ = auVar83._0_4_;
        auVar214._4_4_ = local_500._0_4_;
        auVar214._0_4_ = local_500._0_4_;
        auVar214._8_4_ = local_500._0_4_;
        auVar214._12_4_ = local_500._0_4_;
        auVar214._16_4_ = local_500._0_4_;
        auVar214._20_4_ = local_500._0_4_;
        auVar214._24_4_ = local_500._0_4_;
        auVar214._28_4_ = local_500._0_4_;
        uVar70 = vcmpps_avx512vl(auVar106,auVar214,1);
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar108._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar84._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar84._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar84._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar84._12_4_);
        fVar158 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
        auVar108._16_4_ = fVar158;
        fVar168 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
        auVar108._20_4_ = fVar168;
        fVar159 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
        auVar108._24_4_ = fVar159;
        auVar108._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar109._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar92._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar92._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar92._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar92._12_4_);
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar92._16_4_);
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar92._20_4_);
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar92._24_4_);
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar109._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar92._28_4_;
        auVar106 = vandps_avx(auVar221,ZEXT1632(auVar88));
        auVar107 = vandps_avx(auVar105,auVar221);
        auVar107 = vmaxps_avx(auVar106,auVar107);
        auVar106 = vandps_avx(auVar104,auVar221);
        auVar106 = vmaxps_avx(auVar107,auVar106);
        uVar70 = vcmpps_avx512vl(auVar106,auVar214,1);
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar110._0_4_ = (float)((uint)bVar13 * auVar98._0_4_ | (uint)!bVar13 * auVar88._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar88._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar88._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar88._12_4_);
        fVar160 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
        auVar110._16_4_ = fVar160;
        fVar167 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
        auVar110._20_4_ = fVar167;
        fVar180 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
        auVar110._24_4_ = fVar180;
        uVar71 = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
        auVar110._28_4_ = uVar71;
        bVar13 = (bool)((byte)uVar70 & 1);
        auVar111._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar105._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar105._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar105._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar105._12_4_);
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar105._16_4_);
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar105._20_4_);
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar105._24_4_);
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar111._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar105._28_4_;
        auVar90 = vxorps_avx512vl(auVar183,auVar183);
        auVar106 = vfmadd213ps_avx512vl(auVar108,auVar108,ZEXT1632(auVar90));
        auVar83 = vfmadd231ps_fma(auVar106,auVar109,auVar109);
        auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar81 = auVar107._0_4_;
        fVar82 = auVar107._4_4_;
        fVar132 = auVar107._8_4_;
        fVar133 = auVar107._12_4_;
        fVar134 = auVar107._16_4_;
        fVar135 = auVar107._20_4_;
        fVar137 = auVar107._24_4_;
        auVar106._4_4_ = fVar82 * fVar82 * fVar82 * auVar83._4_4_ * -0.5;
        auVar106._0_4_ = fVar81 * fVar81 * fVar81 * auVar83._0_4_ * -0.5;
        auVar106._8_4_ = fVar132 * fVar132 * fVar132 * auVar83._8_4_ * -0.5;
        auVar106._12_4_ = fVar133 * fVar133 * fVar133 * auVar83._12_4_ * -0.5;
        auVar106._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar106._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar106._24_4_ = fVar137 * fVar137 * fVar137 * -0.0;
        auVar106._28_4_ = auVar104._28_4_;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar107);
        auVar107._4_4_ = auVar109._4_4_ * auVar106._4_4_;
        auVar107._0_4_ = auVar109._0_4_ * auVar106._0_4_;
        auVar107._8_4_ = auVar109._8_4_ * auVar106._8_4_;
        auVar107._12_4_ = auVar109._12_4_ * auVar106._12_4_;
        auVar107._16_4_ = auVar109._16_4_ * auVar106._16_4_;
        auVar107._20_4_ = auVar109._20_4_ * auVar106._20_4_;
        auVar107._24_4_ = auVar109._24_4_ * auVar106._24_4_;
        auVar107._28_4_ = 0;
        auVar105._4_4_ = auVar106._4_4_ * -auVar108._4_4_;
        auVar105._0_4_ = auVar106._0_4_ * -auVar108._0_4_;
        auVar105._8_4_ = auVar106._8_4_ * -auVar108._8_4_;
        auVar105._12_4_ = auVar106._12_4_ * -auVar108._12_4_;
        auVar105._16_4_ = auVar106._16_4_ * -fVar158;
        auVar105._20_4_ = auVar106._20_4_ * -fVar168;
        auVar105._24_4_ = auVar106._24_4_ * -fVar159;
        auVar105._28_4_ = auVar109._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,ZEXT1632(auVar90));
        auVar99 = ZEXT1632(auVar90);
        auVar104 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar99);
        auVar83 = vfmadd231ps_fma(auVar104,auVar111,auVar111);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar168 = auVar103._0_4_;
        fVar158 = auVar103._4_4_;
        fVar159 = auVar103._8_4_;
        fVar81 = auVar103._12_4_;
        fVar82 = auVar103._16_4_;
        fVar132 = auVar103._20_4_;
        fVar133 = auVar103._24_4_;
        auVar104._4_4_ = fVar158 * fVar158 * fVar158 * auVar83._4_4_ * -0.5;
        auVar104._0_4_ = fVar168 * fVar168 * fVar168 * auVar83._0_4_ * -0.5;
        auVar104._8_4_ = fVar159 * fVar159 * fVar159 * auVar83._8_4_ * -0.5;
        auVar104._12_4_ = fVar81 * fVar81 * fVar81 * auVar83._12_4_ * -0.5;
        auVar104._16_4_ = fVar82 * fVar82 * fVar82 * -0.0;
        auVar104._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar104._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar104._28_4_ = 0;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar103);
        auVar93._4_4_ = auVar111._4_4_ * auVar104._4_4_;
        auVar93._0_4_ = auVar111._0_4_ * auVar104._0_4_;
        auVar93._8_4_ = auVar111._8_4_ * auVar104._8_4_;
        auVar93._12_4_ = auVar111._12_4_ * auVar104._12_4_;
        auVar93._16_4_ = auVar111._16_4_ * auVar104._16_4_;
        auVar93._20_4_ = auVar111._20_4_ * auVar104._20_4_;
        auVar93._24_4_ = auVar111._24_4_ * auVar104._24_4_;
        auVar93._28_4_ = auVar103._28_4_;
        auVar103._4_4_ = -auVar110._4_4_ * auVar104._4_4_;
        auVar103._0_4_ = -auVar110._0_4_ * auVar104._0_4_;
        auVar103._8_4_ = -auVar110._8_4_ * auVar104._8_4_;
        auVar103._12_4_ = -auVar110._12_4_ * auVar104._12_4_;
        auVar103._16_4_ = -fVar160 * auVar104._16_4_;
        auVar103._20_4_ = -fVar167 * auVar104._20_4_;
        auVar103._24_4_ = -fVar180 * auVar104._24_4_;
        auVar103._28_4_ = uVar71 ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar104,auVar99);
        auVar83 = vfmadd213ps_fma(auVar107,auVar100,auVar95);
        auVar84 = vfmadd213ps_fma(auVar105,auVar100,auVar96);
        auVar92 = vfmadd213ps_avx512vl(auVar106,auVar100,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar93,ZEXT1632(auVar24),ZEXT1632(auVar22));
        auVar89 = vfnmadd213ps_fma(auVar107,auVar100,auVar95);
        auVar95 = ZEXT1632(auVar24);
        auVar88 = vfmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar23));
        auVar226 = vfnmadd213ps_fma(auVar105,auVar100,auVar96);
        auVar19 = vfmadd213ps_fma(auVar104,auVar95,auVar94);
        auVar107 = vfnmadd231ps_avx512vl(auVar97,auVar100,auVar106);
        auVar22 = vfnmadd213ps_fma(auVar93,auVar95,ZEXT1632(auVar22));
        auVar23 = vfnmadd213ps_fma(auVar103,auVar95,ZEXT1632(auVar23));
        auVar28 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar24),auVar104);
        auVar105 = vsubps_avx512vl(auVar98,ZEXT1632(auVar89));
        auVar106 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar226));
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar19),auVar107);
        auVar93 = vmulps_avx512vl(auVar106,auVar107);
        auVar20 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar226),auVar104);
        auVar94._4_4_ = auVar89._4_4_ * auVar104._4_4_;
        auVar94._0_4_ = auVar89._0_4_ * auVar104._0_4_;
        auVar94._8_4_ = auVar89._8_4_ * auVar104._8_4_;
        auVar94._12_4_ = auVar89._12_4_ * auVar104._12_4_;
        auVar94._16_4_ = auVar104._16_4_ * 0.0;
        auVar94._20_4_ = auVar104._20_4_ * 0.0;
        auVar94._24_4_ = auVar104._24_4_ * 0.0;
        auVar94._28_4_ = auVar104._28_4_;
        auVar104 = vfmsub231ps_avx512vl(auVar94,auVar107,auVar105);
        auVar97._4_4_ = auVar226._4_4_ * auVar105._4_4_;
        auVar97._0_4_ = auVar226._0_4_ * auVar105._0_4_;
        auVar97._8_4_ = auVar226._8_4_ * auVar105._8_4_;
        auVar97._12_4_ = auVar226._12_4_ * auVar105._12_4_;
        auVar97._16_4_ = auVar105._16_4_ * 0.0;
        auVar97._20_4_ = auVar105._20_4_ * 0.0;
        auVar97._24_4_ = auVar105._24_4_ * 0.0;
        auVar97._28_4_ = auVar105._28_4_;
        auVar21 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar89),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar99,auVar104);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,ZEXT1632(auVar20));
        auVar101 = ZEXT1632(auVar90);
        uVar70 = vcmpps_avx512vl(auVar106,auVar101,2);
        bVar69 = (byte)uVar70;
        fVar81 = (float)((uint)(bVar69 & 1) * auVar83._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar22._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar132 = (float)((uint)bVar13 * auVar83._4_4_ | (uint)!bVar13 * auVar22._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar134 = (float)((uint)bVar13 * auVar83._8_4_ | (uint)!bVar13 * auVar22._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar137 = (float)((uint)bVar13 * auVar83._12_4_ | (uint)!bVar13 * auVar22._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(fVar132,fVar81))));
        fVar82 = (float)((uint)(bVar69 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar23._0_4_);
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar133 = (float)((uint)bVar13 * auVar84._4_4_ | (uint)!bVar13 * auVar23._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar135 = (float)((uint)bVar13 * auVar84._8_4_ | (uint)!bVar13 * auVar23._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar138 = (float)((uint)bVar13 * auVar84._12_4_ | (uint)!bVar13 * auVar23._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(fVar133,fVar82))));
        auVar99._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar28._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar28._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar28._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar28._12_4_);
        fVar168 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_);
        auVar99._16_4_ = fVar168;
        fVar158 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_);
        auVar99._20_4_ = fVar158;
        fVar159 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_);
        auVar99._24_4_ = fVar159;
        iVar1 = (uint)(byte)(uVar70 >> 7) * auVar92._28_4_;
        auVar99._28_4_ = iVar1;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar98);
        auVar112._0_4_ =
             (uint)(bVar69 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar20._0_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar20._4_4_;
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar20._8_4_;
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar20._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_;
        auVar112._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(ZEXT1632(auVar226),ZEXT1632(auVar88));
        auVar113._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar84._0_4_
                    );
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar84._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar84._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar84._12_4_);
        fVar160 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_);
        auVar113._16_4_ = fVar160;
        fVar167 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_);
        auVar113._20_4_ = fVar167;
        fVar180 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_);
        auVar113._24_4_ = fVar180;
        auVar113._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar105._28_4_;
        auVar105 = vblendmps_avx512vl(auVar107,ZEXT1632(auVar19));
        auVar114._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar92._0_4_
                    );
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar92._4_4_);
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar92._8_4_);
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar92._12_4_);
        bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar13 * auVar105._16_4_ | (uint)!bVar13 * auVar92._16_4_);
        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar13 * auVar105._20_4_ | (uint)!bVar13 * auVar92._20_4_);
        bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar13 * auVar105._24_4_ | (uint)!bVar13 * auVar92._24_4_);
        bVar13 = SUB81(uVar70 >> 7,0);
        auVar114._28_4_ = (uint)bVar13 * auVar105._28_4_ | (uint)!bVar13 * auVar92._28_4_;
        auVar115._0_4_ =
             (uint)(bVar69 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar98._0_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar13 * (int)auVar89._4_4_ | (uint)!bVar13 * auVar98._4_4_;
        bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar13 * (int)auVar89._8_4_ | (uint)!bVar13 * auVar98._8_4_;
        bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar13 * (int)auVar89._12_4_ | (uint)!bVar13 * auVar98._12_4_;
        auVar115._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_;
        auVar115._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_;
        auVar115._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_;
        auVar115._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar98._28_4_;
        bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._0_4_ =
             (uint)(bVar69 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar19._0_4_;
        bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar19._4_4_;
        bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar19._8_4_;
        bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar19._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar107._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar107._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar107._24_4_;
        iVar2 = (uint)(byte)(uVar70 >> 7) * auVar107._28_4_;
        auVar116._28_4_ = iVar2;
        auVar97 = vsubps_avx512vl(auVar115,auVar103);
        auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar226._12_4_ |
                                                 (uint)!bVar16 * auVar88._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar226._8_4_ |
                                                          (uint)!bVar15 * auVar88._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar226._4_4_ |
                                                                   (uint)!bVar13 * auVar88._4_4_,
                                                                   (uint)(bVar69 & 1) *
                                                                   (int)auVar226._0_4_ |
                                                                   (uint)!(bool)(bVar69 & 1) *
                                                                   auVar88._0_4_)))),auVar94);
        auVar205 = ZEXT3264(auVar107);
        auVar105 = vsubps_avx(auVar116,auVar99);
        auVar104 = vsubps_avx(auVar103,auVar112);
        auVar210 = ZEXT3264(auVar104);
        auVar92 = vsubps_avx(auVar94,auVar113);
        auVar93 = vsubps_avx(auVar99,auVar114);
        auVar95._4_4_ = auVar105._4_4_ * fVar132;
        auVar95._0_4_ = auVar105._0_4_ * fVar81;
        auVar95._8_4_ = auVar105._8_4_ * fVar134;
        auVar95._12_4_ = auVar105._12_4_ * fVar137;
        auVar95._16_4_ = auVar105._16_4_ * 0.0;
        auVar95._20_4_ = auVar105._20_4_ * 0.0;
        auVar95._24_4_ = auVar105._24_4_ * 0.0;
        auVar95._28_4_ = iVar2;
        auVar83 = vfmsub231ps_fma(auVar95,auVar99,auVar97);
        auVar96._4_4_ = fVar133 * auVar97._4_4_;
        auVar96._0_4_ = fVar82 * auVar97._0_4_;
        auVar96._8_4_ = fVar135 * auVar97._8_4_;
        auVar96._12_4_ = fVar138 * auVar97._12_4_;
        auVar96._16_4_ = auVar97._16_4_ * 0.0;
        auVar96._20_4_ = auVar97._20_4_ * 0.0;
        auVar96._24_4_ = auVar97._24_4_ * 0.0;
        auVar96._28_4_ = auVar106._28_4_;
        auVar84 = vfmsub231ps_fma(auVar96,auVar103,auVar107);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar101,ZEXT1632(auVar83));
        auVar197._0_4_ = auVar107._0_4_ * auVar99._0_4_;
        auVar197._4_4_ = auVar107._4_4_ * auVar99._4_4_;
        auVar197._8_4_ = auVar107._8_4_ * auVar99._8_4_;
        auVar197._12_4_ = auVar107._12_4_ * auVar99._12_4_;
        auVar197._16_4_ = auVar107._16_4_ * fVar168;
        auVar197._20_4_ = auVar107._20_4_ * fVar158;
        auVar197._24_4_ = auVar107._24_4_ * fVar159;
        auVar197._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar197,auVar94,auVar105);
        auVar95 = vfmadd231ps_avx512vl(auVar106,auVar101,ZEXT1632(auVar83));
        auVar106 = vmulps_avx512vl(auVar93,auVar112);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar104,auVar114);
        auVar98._4_4_ = auVar92._4_4_ * auVar114._4_4_;
        auVar98._0_4_ = auVar92._0_4_ * auVar114._0_4_;
        auVar98._8_4_ = auVar92._8_4_ * auVar114._8_4_;
        auVar98._12_4_ = auVar92._12_4_ * auVar114._12_4_;
        auVar98._16_4_ = auVar92._16_4_ * auVar114._16_4_;
        auVar98._20_4_ = auVar92._20_4_ * auVar114._20_4_;
        auVar98._24_4_ = auVar92._24_4_ * auVar114._24_4_;
        auVar98._28_4_ = auVar114._28_4_;
        auVar83 = vfmsub231ps_fma(auVar98,auVar113,auVar93);
        auVar198._0_4_ = auVar113._0_4_ * auVar104._0_4_;
        auVar198._4_4_ = auVar113._4_4_ * auVar104._4_4_;
        auVar198._8_4_ = auVar113._8_4_ * auVar104._8_4_;
        auVar198._12_4_ = auVar113._12_4_ * auVar104._12_4_;
        auVar198._16_4_ = fVar160 * auVar104._16_4_;
        auVar198._20_4_ = fVar167 * auVar104._20_4_;
        auVar198._24_4_ = fVar180 * auVar104._24_4_;
        auVar198._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar198,auVar92,auVar112);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar101,auVar106);
        auVar96 = vfmadd231ps_avx512vl(auVar106,auVar101,ZEXT1632(auVar83));
        auVar201 = ZEXT3264(auVar96);
        auVar106 = vmaxps_avx(auVar95,auVar96);
        uVar161 = vcmpps_avx512vl(auVar106,auVar101,2);
        bVar78 = bVar78 & (byte)uVar161;
        if (bVar78 != 0) {
          uVar141 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar222._4_4_ = uVar141;
          auVar222._0_4_ = uVar141;
          auVar222._8_4_ = uVar141;
          auVar222._12_4_ = uVar141;
          auVar222._16_4_ = uVar141;
          auVar222._20_4_ = uVar141;
          auVar222._24_4_ = uVar141;
          auVar222._28_4_ = uVar141;
          auVar225 = ZEXT3264(auVar222);
          auVar40._4_4_ = auVar93._4_4_ * auVar107._4_4_;
          auVar40._0_4_ = auVar93._0_4_ * auVar107._0_4_;
          auVar40._8_4_ = auVar93._8_4_ * auVar107._8_4_;
          auVar40._12_4_ = auVar93._12_4_ * auVar107._12_4_;
          auVar40._16_4_ = auVar93._16_4_ * auVar107._16_4_;
          auVar40._20_4_ = auVar93._20_4_ * auVar107._20_4_;
          auVar40._24_4_ = auVar93._24_4_ * auVar107._24_4_;
          auVar40._28_4_ = auVar106._28_4_;
          auVar19 = vfmsub231ps_fma(auVar40,auVar92,auVar105);
          auVar41._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar41._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar41._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar41._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar41._16_4_ = auVar105._16_4_ * auVar104._16_4_;
          auVar41._20_4_ = auVar105._20_4_ * auVar104._20_4_;
          auVar41._24_4_ = auVar105._24_4_ * auVar104._24_4_;
          auVar41._28_4_ = auVar105._28_4_;
          auVar88 = vfmsub231ps_fma(auVar41,auVar97,auVar93);
          auVar42._4_4_ = auVar92._4_4_ * auVar97._4_4_;
          auVar42._0_4_ = auVar92._0_4_ * auVar97._0_4_;
          auVar42._8_4_ = auVar92._8_4_ * auVar97._8_4_;
          auVar42._12_4_ = auVar92._12_4_ * auVar97._12_4_;
          auVar42._16_4_ = auVar92._16_4_ * auVar97._16_4_;
          auVar42._20_4_ = auVar92._20_4_ * auVar97._20_4_;
          auVar42._24_4_ = auVar92._24_4_ * auVar97._24_4_;
          auVar42._28_4_ = auVar92._28_4_;
          auVar20 = vfmsub231ps_fma(auVar42,auVar104,auVar107);
          auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar20));
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar19),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar106 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = 0x3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar35._16_4_ = 0x3f800000;
          auVar35._20_4_ = 0x3f800000;
          auVar35._24_4_ = 0x3f800000;
          auVar35._28_4_ = 0x3f800000;
          auVar107 = vfnmadd213ps_avx512vl(auVar106,ZEXT1632(auVar84),auVar35);
          auVar83 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
          auVar205 = ZEXT1664(auVar83);
          auVar43._4_4_ = auVar20._4_4_ * auVar99._4_4_;
          auVar43._0_4_ = auVar20._0_4_ * auVar99._0_4_;
          auVar43._8_4_ = auVar20._8_4_ * auVar99._8_4_;
          auVar43._12_4_ = auVar20._12_4_ * auVar99._12_4_;
          auVar43._16_4_ = fVar168 * 0.0;
          auVar43._20_4_ = fVar158 * 0.0;
          auVar43._24_4_ = fVar159 * 0.0;
          auVar43._28_4_ = iVar1;
          auVar88 = vfmadd231ps_fma(auVar43,auVar94,ZEXT1632(auVar88));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar103,ZEXT1632(auVar19));
          fVar168 = auVar83._0_4_;
          fVar158 = auVar83._4_4_;
          fVar159 = auVar83._8_4_;
          fVar160 = auVar83._12_4_;
          local_520._28_4_ = auVar106._28_4_;
          local_520._0_28_ =
               ZEXT1628(CONCAT412(auVar88._12_4_ * fVar160,
                                  CONCAT48(auVar88._8_4_ * fVar159,
                                           CONCAT44(auVar88._4_4_ * fVar158,auVar88._0_4_ * fVar168)
                                          )));
          auVar210 = ZEXT3264(local_520);
          auVar150._4_4_ = local_4a0;
          auVar150._0_4_ = local_4a0;
          auVar150._8_4_ = local_4a0;
          auVar150._12_4_ = local_4a0;
          auVar150._16_4_ = local_4a0;
          auVar150._20_4_ = local_4a0;
          auVar150._24_4_ = local_4a0;
          auVar150._28_4_ = local_4a0;
          uVar161 = vcmpps_avx512vl(local_520,auVar222,2);
          uVar25 = vcmpps_avx512vl(auVar150,local_520,2);
          bVar78 = (byte)uVar161 & (byte)uVar25 & bVar78;
          if (bVar78 != 0) {
            uVar79 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar79 = bVar78 & uVar79;
            if ((char)uVar79 != '\0') {
              fVar167 = auVar95._0_4_ * fVar168;
              fVar180 = auVar95._4_4_ * fVar158;
              auVar44._4_4_ = fVar180;
              auVar44._0_4_ = fVar167;
              fVar81 = auVar95._8_4_ * fVar159;
              auVar44._8_4_ = fVar81;
              fVar82 = auVar95._12_4_ * fVar160;
              auVar44._12_4_ = fVar82;
              fVar132 = auVar95._16_4_ * 0.0;
              auVar44._16_4_ = fVar132;
              fVar133 = auVar95._20_4_ * 0.0;
              auVar44._20_4_ = fVar133;
              fVar134 = auVar95._24_4_ * 0.0;
              auVar44._24_4_ = fVar134;
              auVar44._28_4_ = auVar95._28_4_;
              auVar151._8_4_ = 0x3f800000;
              auVar151._0_8_ = 0x3f8000003f800000;
              auVar151._12_4_ = 0x3f800000;
              auVar151._16_4_ = 0x3f800000;
              auVar151._20_4_ = 0x3f800000;
              auVar151._24_4_ = 0x3f800000;
              auVar151._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar151,auVar44);
              local_2c0._0_4_ =
                   (float)((uint)(bVar69 & 1) * (int)fVar167 |
                          (uint)!(bool)(bVar69 & 1) * auVar106._0_4_);
              bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
              local_2c0._4_4_ =
                   (float)((uint)bVar13 * (int)fVar180 | (uint)!bVar13 * auVar106._4_4_);
              bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar13 * (int)fVar81 | (uint)!bVar13 * auVar106._8_4_)
              ;
              bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar13 * (int)fVar82 | (uint)!bVar13 * auVar106._12_4_);
              bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar13 * (int)fVar132 | (uint)!bVar13 * auVar106._16_4_);
              bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar13 * (int)fVar133 | (uint)!bVar13 * auVar106._20_4_);
              bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar13 * (int)fVar134 | (uint)!bVar13 * auVar106._24_4_);
              bVar13 = SUB81(uVar70 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar13 * auVar95._28_4_ | (uint)!bVar13 * auVar106._28_4_);
              auVar106 = vsubps_avx(ZEXT1632(auVar24),auVar100);
              auVar83 = vfmadd213ps_fma(auVar106,local_2c0,auVar100);
              uVar141 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
              auVar100._4_4_ = uVar141;
              auVar100._0_4_ = uVar141;
              auVar100._8_4_ = uVar141;
              auVar100._12_4_ = uVar141;
              auVar100._16_4_ = uVar141;
              auVar100._20_4_ = uVar141;
              auVar100._24_4_ = uVar141;
              auVar100._28_4_ = uVar141;
              auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                            CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                     CONCAT44(auVar83._4_4_ +
                                                                              auVar83._4_4_,
                                                                              auVar83._0_4_ +
                                                                              auVar83._0_4_)))),
                                         auVar100);
              uVar80 = vcmpps_avx512vl(local_520,auVar106,6);
              uVar79 = uVar79 & uVar80;
              bVar78 = (byte)uVar79;
              if (bVar78 != 0) {
                auVar178._0_4_ = auVar96._0_4_ * fVar168;
                auVar178._4_4_ = auVar96._4_4_ * fVar158;
                auVar178._8_4_ = auVar96._8_4_ * fVar159;
                auVar178._12_4_ = auVar96._12_4_ * fVar160;
                auVar178._16_4_ = auVar96._16_4_ * 0.0;
                auVar178._20_4_ = auVar96._20_4_ * 0.0;
                auVar178._24_4_ = auVar96._24_4_ * 0.0;
                auVar178._28_4_ = 0;
                auVar184._8_4_ = 0x3f800000;
                auVar184._0_8_ = 0x3f8000003f800000;
                auVar184._12_4_ = 0x3f800000;
                auVar184._16_4_ = 0x3f800000;
                auVar184._20_4_ = 0x3f800000;
                auVar184._24_4_ = 0x3f800000;
                auVar184._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar184,auVar178);
                auVar117._0_4_ =
                     (uint)(bVar69 & 1) * (int)auVar178._0_4_ |
                     (uint)!(bool)(bVar69 & 1) * auVar106._0_4_;
                bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                auVar117._4_4_ = (uint)bVar13 * (int)auVar178._4_4_ | (uint)!bVar13 * auVar106._4_4_
                ;
                bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                auVar117._8_4_ = (uint)bVar13 * (int)auVar178._8_4_ | (uint)!bVar13 * auVar106._8_4_
                ;
                bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                auVar117._12_4_ =
                     (uint)bVar13 * (int)auVar178._12_4_ | (uint)!bVar13 * auVar106._12_4_;
                bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                auVar117._16_4_ =
                     (uint)bVar13 * (int)auVar178._16_4_ | (uint)!bVar13 * auVar106._16_4_;
                bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                auVar117._20_4_ =
                     (uint)bVar13 * (int)auVar178._20_4_ | (uint)!bVar13 * auVar106._20_4_;
                bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                auVar117._24_4_ =
                     (uint)bVar13 * (int)auVar178._24_4_ | (uint)!bVar13 * auVar106._24_4_;
                auVar117._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar106._28_4_;
                auVar36._8_4_ = 0x40000000;
                auVar36._0_8_ = 0x4000000040000000;
                auVar36._12_4_ = 0x40000000;
                auVar36._16_4_ = 0x40000000;
                auVar36._20_4_ = 0x40000000;
                auVar36._24_4_ = 0x40000000;
                auVar36._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar117,auVar184,auVar36);
                local_280 = local_520;
                local_260 = 0;
                local_25c = iVar8;
                local_250 = local_5a0._0_8_;
                uStack_248 = local_5a0._8_8_;
                local_240 = local_5b0._0_8_;
                uStack_238 = local_5b0._8_8_;
                local_230 = local_5c0._0_8_;
                uStack_228 = local_5c0._8_8_;
                local_220 = local_5d0;
                uStack_218 = uStack_5c8;
                if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar168 = 1.0 / auVar102._0_4_;
                  local_200[0] = fVar168 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar168 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar168 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar168 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar168 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar168 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar168 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_520;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar106 = vblendmps_avx512vl(auVar152,local_520);
                  auVar118._0_4_ =
                       (uint)(bVar78 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
                  auVar118._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
                  auVar118._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
                  auVar118._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 4) & 1);
                  auVar118._16_4_ = (uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 5) & 1);
                  auVar118._20_4_ = (uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar79 >> 6) & 1);
                  auVar118._24_4_ = (uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar79 >> 7,0);
                  auVar118._28_4_ = (uint)bVar13 * auVar106._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar106 = vshufps_avx(auVar118,auVar118,0xb1);
                  auVar106 = vminps_avx(auVar118,auVar106);
                  auVar107 = vshufpd_avx(auVar106,auVar106,5);
                  auVar106 = vminps_avx(auVar106,auVar107);
                  auVar107 = vpermpd_avx2(auVar106,0x4e);
                  auVar106 = vminps_avx(auVar106,auVar107);
                  uVar161 = vcmpps_avx512vl(auVar118,auVar106,0);
                  uVar71 = (uint)uVar79;
                  if (((byte)uVar161 & bVar78) != 0) {
                    uVar71 = (uint)((byte)uVar161 & bVar78);
                  }
                  uVar72 = 0;
                  for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                    uVar72 = uVar72 + 1;
                  }
                  uVar70 = (ulong)uVar72;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar83 = vpbroadcastd_avx512vl();
                    local_3e0 = auVar83._0_4_;
                    uStack_3dc = auVar83._4_4_;
                    uStack_3d8 = auVar83._8_4_;
                    uStack_3d4 = auVar83._12_4_;
                    local_540 = vpbroadcastd_avx512vl();
                    do {
                      fVar168 = local_200[uVar70];
                      local_440._4_4_ = fVar168;
                      local_440._0_4_ = fVar168;
                      local_440._8_4_ = fVar168;
                      local_440._12_4_ = fVar168;
                      local_430 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar70 * 4);
                      local_588.context = context->user;
                      fVar158 = 1.0 - fVar168;
                      auVar34._8_4_ = 0x80000000;
                      auVar34._0_8_ = 0x8000000080000000;
                      auVar34._12_4_ = 0x80000000;
                      auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar158),auVar34);
                      auVar83 = ZEXT416((uint)(fVar168 * fVar158 * 4.0));
                      auVar84 = vfnmsub213ss_fma(local_440,local_440,auVar83);
                      auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),
                                                auVar83);
                      fVar158 = fVar158 * auVar88._0_4_ * 0.5;
                      fVar159 = auVar84._0_4_ * 0.5;
                      auVar205 = ZEXT464((uint)fVar159);
                      fVar160 = auVar83._0_4_ * 0.5;
                      fVar168 = fVar168 * fVar168 * 0.5;
                      auVar195._0_4_ = fVar168 * (float)local_5d0._0_4_;
                      auVar195._4_4_ = fVar168 * (float)local_5d0._4_4_;
                      auVar195._8_4_ = fVar168 * (float)uStack_5c8;
                      auVar195._12_4_ = fVar168 * uStack_5c8._4_4_;
                      auVar148._4_4_ = fVar160;
                      auVar148._0_4_ = fVar160;
                      auVar148._8_4_ = fVar160;
                      auVar148._12_4_ = fVar160;
                      auVar83 = vfmadd132ps_fma(auVar148,auVar195,local_5c0);
                      auVar196._4_4_ = fVar159;
                      auVar196._0_4_ = fVar159;
                      auVar196._8_4_ = fVar159;
                      auVar196._12_4_ = fVar159;
                      auVar83 = vfmadd132ps_fma(auVar196,auVar83,local_5b0);
                      auVar149._4_4_ = fVar158;
                      auVar149._0_4_ = fVar158;
                      auVar149._8_4_ = fVar158;
                      auVar149._12_4_ = fVar158;
                      auVar83 = vfmadd132ps_fma(auVar149,auVar83,local_5a0);
                      local_470 = auVar83._0_4_;
                      local_460 = vshufps_avx(auVar83,auVar83,0x55);
                      auVar201 = ZEXT1664(local_460);
                      local_450 = vshufps_avx(auVar83,auVar83,0xaa);
                      iStack_46c = local_470;
                      iStack_468 = local_470;
                      iStack_464 = local_470;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      local_420 = local_540._0_8_;
                      uStack_418 = local_540._8_8_;
                      local_410._4_4_ = uStack_3dc;
                      local_410._0_4_ = local_3e0;
                      local_410._8_4_ = uStack_3d8;
                      local_410._12_4_ = uStack_3d4;
                      vpcmpeqd_avx2(ZEXT1632(local_410),ZEXT1632(local_410));
                      uStack_3fc = (local_588.context)->instID[0];
                      local_400 = uStack_3fc;
                      uStack_3f8 = uStack_3fc;
                      uStack_3f4 = uStack_3fc;
                      uStack_3f0 = (local_588.context)->instPrimID[0];
                      uStack_3ec = uStack_3f0;
                      uStack_3e8 = uStack_3f0;
                      uStack_3e4 = uStack_3f0;
                      local_5f0 = local_4d0;
                      local_588.valid = (int *)local_5f0;
                      local_588.geometryUserPtr = pGVar75->userPtr;
                      local_588.hit = (RTCHitN *)&local_470;
                      local_588.N = 4;
                      local_4c0 = auVar225._0_32_;
                      local_588.ray = (RTCRayN *)ray;
                      if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar201 = ZEXT1664(local_460);
                        auVar205 = ZEXT464((uint)fVar159);
                        (*pGVar75->intersectionFilterN)(&local_588);
                        auVar210 = ZEXT3264(local_520);
                        auVar225 = ZEXT3264(local_4c0);
                        auVar228 = ZEXT464(0xbf800000);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar227 = ZEXT1664(auVar83);
                      }
                      uVar80 = vptestmd_avx512vl(local_5f0,local_5f0);
                      if ((uVar80 & 0xf) == 0) {
LAB_01bb570d:
                        *(int *)(ray + k * 4 + 0x80) = auVar225._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar201 = ZEXT1664(auVar201._0_16_);
                          auVar205 = ZEXT1664(auVar205._0_16_);
                          (*p_Var12)(&local_588);
                          auVar210 = ZEXT3264(local_520);
                          auVar225 = ZEXT3264(local_4c0);
                          auVar228 = ZEXT464(0xbf800000);
                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar227 = ZEXT1664(auVar83);
                        }
                        uVar80 = vptestmd_avx512vl(local_5f0,local_5f0);
                        uVar80 = uVar80 & 0xf;
                        bVar78 = (byte)uVar80;
                        if (bVar78 == 0) goto LAB_01bb570d;
                        iVar1 = *(int *)(local_588.hit + 4);
                        iVar2 = *(int *)(local_588.hit + 8);
                        iVar65 = *(int *)(local_588.hit + 0xc);
                        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar15 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_588.ray + 0xc0) =
                             (uint)(bVar78 & 1) * *(int *)local_588.hit |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xc0);
                        *(uint *)(local_588.ray + 0xc4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xc4);
                        *(uint *)(local_588.ray + 200) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 200);
                        *(uint *)(local_588.ray + 0xcc) =
                             (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_588.ray + 0xcc);
                        iVar1 = *(int *)(local_588.hit + 0x14);
                        iVar2 = *(int *)(local_588.hit + 0x18);
                        iVar65 = *(int *)(local_588.hit + 0x1c);
                        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar15 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_588.ray + 0xd0) =
                             (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x10) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xd0);
                        *(uint *)(local_588.ray + 0xd4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xd4);
                        *(uint *)(local_588.ray + 0xd8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 0xd8);
                        *(uint *)(local_588.ray + 0xdc) =
                             (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_588.ray + 0xdc);
                        iVar1 = *(int *)(local_588.hit + 0x24);
                        iVar2 = *(int *)(local_588.hit + 0x28);
                        iVar65 = *(int *)(local_588.hit + 0x2c);
                        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar15 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_588.ray + 0xe0) =
                             (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x20) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xe0);
                        *(uint *)(local_588.ray + 0xe4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xe4);
                        *(uint *)(local_588.ray + 0xe8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 0xe8);
                        *(uint *)(local_588.ray + 0xec) =
                             (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_588.ray + 0xec);
                        iVar1 = *(int *)(local_588.hit + 0x34);
                        iVar2 = *(int *)(local_588.hit + 0x38);
                        iVar65 = *(int *)(local_588.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar15 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_588.ray + 0xf0) =
                             (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x30) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xf0);
                        *(uint *)(local_588.ray + 0xf4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xf4);
                        *(uint *)(local_588.ray + 0xf8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 0xf8);
                        *(uint *)(local_588.ray + 0xfc) =
                             (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_588.ray + 0xfc);
                        iVar1 = *(int *)(local_588.hit + 0x44);
                        iVar2 = *(int *)(local_588.hit + 0x48);
                        iVar65 = *(int *)(local_588.hit + 0x4c);
                        bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                        bVar15 = SUB81(uVar80 >> 3,0);
                        *(uint *)(local_588.ray + 0x100) =
                             (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x40) |
                             (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0x100);
                        *(uint *)(local_588.ray + 0x104) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0x104);
                        *(uint *)(local_588.ray + 0x108) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 0x108);
                        *(uint *)(local_588.ray + 0x10c) =
                             (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_588.ray + 0x10c)
                        ;
                        auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x50));
                        *(undefined1 (*) [16])(local_588.ray + 0x110) = auVar83;
                        auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x60));
                        *(undefined1 (*) [16])(local_588.ray + 0x120) = auVar83;
                        auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x70));
                        *(undefined1 (*) [16])(local_588.ray + 0x130) = auVar83;
                        auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x80));
                        *(undefined1 (*) [16])(local_588.ray + 0x140) = auVar83;
                        auVar225 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                      }
                      bVar78 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar79;
                      uVar141 = auVar225._0_4_;
                      auVar156._4_4_ = uVar141;
                      auVar156._0_4_ = uVar141;
                      auVar156._8_4_ = uVar141;
                      auVar156._12_4_ = uVar141;
                      auVar156._16_4_ = uVar141;
                      auVar156._20_4_ = uVar141;
                      auVar156._24_4_ = uVar141;
                      auVar156._28_4_ = uVar141;
                      uVar161 = vcmpps_avx512vl(auVar210._0_32_,auVar156,2);
                      if ((bVar78 & (byte)uVar161) == 0) goto LAB_01bb467a;
                      bVar78 = bVar78 & (byte)uVar161;
                      uVar79 = (ulong)bVar78;
                      auVar157._8_4_ = 0x7f800000;
                      auVar157._0_8_ = 0x7f8000007f800000;
                      auVar157._12_4_ = 0x7f800000;
                      auVar157._16_4_ = 0x7f800000;
                      auVar157._20_4_ = 0x7f800000;
                      auVar157._24_4_ = 0x7f800000;
                      auVar157._28_4_ = 0x7f800000;
                      auVar106 = vblendmps_avx512vl(auVar157,auVar210._0_32_);
                      auVar131._0_4_ =
                           (uint)(bVar78 & 1) * auVar106._0_4_ |
                           (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 1 & 1);
                      auVar131._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 2 & 1);
                      auVar131._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 3 & 1);
                      auVar131._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 4 & 1);
                      auVar131._16_4_ = (uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 5 & 1);
                      auVar131._20_4_ = (uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar78 >> 6 & 1);
                      auVar131._24_4_ = (uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar131._28_4_ =
                           (uint)(bVar78 >> 7) * auVar106._28_4_ |
                           (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                      auVar106 = vshufps_avx(auVar131,auVar131,0xb1);
                      auVar106 = vminps_avx(auVar131,auVar106);
                      auVar107 = vshufpd_avx(auVar106,auVar106,5);
                      auVar106 = vminps_avx(auVar106,auVar107);
                      auVar107 = vpermpd_avx2(auVar106,0x4e);
                      auVar106 = vminps_avx(auVar106,auVar107);
                      uVar161 = vcmpps_avx512vl(auVar131,auVar106,0);
                      bVar69 = (byte)uVar161 & bVar78;
                      if (bVar69 != 0) {
                        bVar78 = bVar69;
                      }
                      uVar71 = 0;
                      for (uVar72 = (uint)bVar78; (uVar72 & 1) == 0;
                          uVar72 = uVar72 >> 1 | 0x80000000) {
                        uVar71 = uVar71 + 1;
                      }
                      uVar70 = (ulong)uVar71;
                    } while( true );
                  }
                  fVar168 = local_200[uVar70];
                  uVar141 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                  fVar158 = 1.0 - fVar168;
                  auVar30._8_4_ = 0x80000000;
                  auVar30._0_8_ = 0x8000000080000000;
                  auVar30._12_4_ = 0x80000000;
                  auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar158),auVar30);
                  auVar83 = ZEXT416((uint)(fVar168 * fVar158 * 4.0));
                  auVar84 = vfnmsub213ss_fma(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),auVar83);
                  auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),auVar83);
                  fVar158 = fVar158 * auVar88._0_4_ * 0.5;
                  fVar159 = auVar84._0_4_ * 0.5;
                  auVar205 = ZEXT464((uint)fVar159);
                  fVar160 = auVar83._0_4_ * 0.5;
                  fVar167 = fVar168 * fVar168 * 0.5;
                  auVar189._0_4_ = fVar167 * (float)local_5d0._0_4_;
                  auVar189._4_4_ = fVar167 * (float)local_5d0._4_4_;
                  auVar189._8_4_ = fVar167 * (float)uStack_5c8;
                  auVar189._12_4_ = fVar167 * uStack_5c8._4_4_;
                  auVar174._4_4_ = fVar160;
                  auVar174._0_4_ = fVar160;
                  auVar174._8_4_ = fVar160;
                  auVar174._12_4_ = fVar160;
                  auVar83 = vfmadd132ps_fma(auVar174,auVar189,local_5c0);
                  auVar190._4_4_ = fVar159;
                  auVar190._0_4_ = fVar159;
                  auVar190._8_4_ = fVar159;
                  auVar190._12_4_ = fVar159;
                  auVar83 = vfmadd132ps_fma(auVar190,auVar83,local_5b0);
                  auVar201 = ZEXT1664(auVar83);
                  auVar175._4_4_ = fVar158;
                  auVar175._0_4_ = fVar158;
                  auVar175._8_4_ = fVar158;
                  auVar175._12_4_ = fVar158;
                  auVar83 = vfmadd132ps_fma(auVar175,auVar83,local_5a0);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar70 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                  uVar9 = vextractps_avx(auVar83,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                  uVar9 = vextractps_avx(auVar83,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar9;
                  *(float *)(ray + k * 4 + 0xf0) = fVar168;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar141;
                  *(uint *)(ray + k * 4 + 0x110) = uVar7;
                  *(uint *)(ray + k * 4 + 0x120) = uVar76;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01bb467a:
      if (8 < iVar8) {
        local_4c0 = vpbroadcastd_avx512vl();
        local_3e0 = local_500._0_4_;
        uStack_3dc = local_500._0_4_;
        uStack_3d8 = local_500._0_4_;
        uStack_3d4 = local_500._0_4_;
        uStack_3d0 = local_500._0_4_;
        uStack_3cc = local_500._0_4_;
        uStack_3c8 = local_500._0_4_;
        uStack_3c4 = local_500._0_4_;
        uStack_49c = local_4a0;
        uStack_498 = local_4a0;
        uStack_494 = local_4a0;
        uStack_490 = local_4a0;
        uStack_48c = local_4a0;
        uStack_488 = local_4a0;
        uStack_484 = local_4a0;
        local_100 = 1.0 / (float)local_550._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_550 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar73 = 8;
LAB_01bb4736:
        auVar106 = vpbroadcastd_avx512vl();
        auVar106 = vpor_avx2(auVar106,_DAT_01fe9900);
        uVar25 = vpcmpd_avx512vl(auVar106,local_4c0,1);
        auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar73 * 4 + lVar26);
        auVar107 = *(undefined1 (*) [32])(lVar26 + 0x21aefac + lVar73 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar26 + 0x21af430 + lVar73 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar26 + 0x21af8b4 + lVar73 * 4);
        fVar168 = auVar104._0_4_;
        auVar225._0_4_ = fVar168 * (float)local_3a0._0_4_;
        fVar158 = auVar104._4_4_;
        auVar225._4_4_ = fVar158 * (float)local_3a0._4_4_;
        fVar159 = auVar104._8_4_;
        auVar225._8_4_ = fVar159 * fStack_398;
        fVar160 = auVar104._12_4_;
        auVar225._12_4_ = fVar160 * fStack_394;
        fVar167 = auVar104._16_4_;
        auVar225._16_4_ = fVar167 * fStack_390;
        fVar180 = auVar104._20_4_;
        auVar225._20_4_ = fVar180 * fStack_38c;
        auVar225._28_36_ = auVar205._28_36_;
        fVar81 = auVar104._24_4_;
        auVar225._24_4_ = fVar81 * fStack_388;
        auVar205._0_4_ = fVar168 * (float)local_3c0._0_4_;
        auVar205._4_4_ = fVar158 * (float)local_3c0._4_4_;
        auVar205._8_4_ = fVar159 * fStack_3b8;
        auVar205._12_4_ = fVar160 * fStack_3b4;
        auVar205._16_4_ = fVar167 * fStack_3b0;
        auVar205._20_4_ = fVar180 * fStack_3ac;
        auVar205._28_36_ = auVar201._28_36_;
        auVar205._24_4_ = fVar81 * fStack_3a8;
        auVar92 = vmulps_avx512vl(local_e0,auVar104);
        auVar93 = vfmadd231ps_avx512vl(auVar225._0_32_,auVar105,local_360);
        auVar103 = vfmadd231ps_avx512vl(auVar205._0_32_,auVar105,local_380);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_c0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_320);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_340);
        auVar94 = vfmadd231ps_avx512vl(auVar92,auVar107,local_a0);
        auVar83 = vfmadd231ps_fma(auVar93,auVar106,local_2e0);
        auVar205 = ZEXT1664(auVar83);
        auVar84 = vfmadd231ps_fma(auVar103,auVar106,local_300);
        auVar201 = ZEXT1664(auVar84);
        auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar73 * 4 + lVar26);
        auVar93 = *(undefined1 (*) [32])(lVar26 + 0x21b13cc + lVar73 * 4);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar106,local_80);
        auVar103 = *(undefined1 (*) [32])(lVar26 + 0x21b1850 + lVar73 * 4);
        auVar94 = *(undefined1 (*) [32])(lVar26 + 0x21b1cd4 + lVar73 * 4);
        fVar82 = auVar94._0_4_;
        auVar211._0_4_ = fVar82 * (float)local_3a0._0_4_;
        fVar132 = auVar94._4_4_;
        auVar211._4_4_ = fVar132 * (float)local_3a0._4_4_;
        fVar133 = auVar94._8_4_;
        auVar211._8_4_ = fVar133 * fStack_398;
        fVar134 = auVar94._12_4_;
        auVar211._12_4_ = fVar134 * fStack_394;
        fVar135 = auVar94._16_4_;
        auVar211._16_4_ = fVar135 * fStack_390;
        fVar137 = auVar94._20_4_;
        auVar211._20_4_ = fVar137 * fStack_38c;
        auVar211._28_36_ = auVar210._28_36_;
        fVar138 = auVar94._24_4_;
        auVar211._24_4_ = fVar138 * fStack_388;
        auVar45._4_4_ = fVar132 * (float)local_3c0._4_4_;
        auVar45._0_4_ = fVar82 * (float)local_3c0._0_4_;
        auVar45._8_4_ = fVar133 * fStack_3b8;
        auVar45._12_4_ = fVar134 * fStack_3b4;
        auVar45._16_4_ = fVar135 * fStack_3b0;
        auVar45._20_4_ = fVar137 * fStack_3ac;
        auVar45._24_4_ = fVar138 * fStack_3a8;
        auVar45._28_4_ = uStack_3a4;
        auVar97 = vmulps_avx512vl(local_e0,auVar94);
        auVar96 = vfmadd231ps_avx512vl(auVar211._0_32_,auVar103,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar45,auVar103,local_380);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_340);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_a0);
        auVar88 = vfmadd231ps_fma(auVar96,auVar92,local_2e0);
        auVar210 = ZEXT1664(auVar88);
        auVar19 = vfmadd231ps_fma(auVar98,auVar92,local_300);
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar92,local_80);
        auVar98 = vmaxps_avx512vl(auVar95,auVar96);
        auVar97 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar83));
        auVar99 = vsubps_avx512vl(ZEXT1632(auVar19),ZEXT1632(auVar84));
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar84),auVar97);
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar83),auVar99);
        auVar100 = vsubps_avx512vl(auVar100,auVar101);
        auVar101 = vmulps_avx512vl(auVar99,auVar99);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar101);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        uVar161 = vcmpps_avx512vl(auVar100,auVar98,2);
        bVar78 = (byte)uVar25 & (byte)uVar161;
        if (bVar78 != 0) {
          fVar136 = local_180._0_4_;
          fVar139 = local_180._4_4_;
          auVar46._4_4_ = fVar139 * fVar132;
          auVar46._0_4_ = fVar136 * fVar82;
          fVar82 = local_180._8_4_;
          auVar46._8_4_ = fVar82 * fVar133;
          fVar132 = local_180._12_4_;
          auVar46._12_4_ = fVar132 * fVar134;
          fVar133 = local_180._16_4_;
          auVar46._16_4_ = fVar133 * fVar135;
          fVar134 = local_180._20_4_;
          auVar46._20_4_ = fVar134 * fVar137;
          fVar135 = local_180._24_4_;
          auVar46._24_4_ = fVar135 * fVar138;
          auVar46._28_4_ = auVar94._28_4_;
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar46);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar103);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_120,auVar93);
          auVar47._4_4_ = fVar139 * fVar158;
          auVar47._0_4_ = fVar136 * fVar168;
          auVar47._8_4_ = fVar82 * fVar159;
          auVar47._12_4_ = fVar132 * fVar160;
          auVar47._16_4_ = fVar133 * fVar167;
          auVar47._20_4_ = fVar134 * fVar180;
          auVar47._24_4_ = fVar135 * fVar81;
          auVar47._28_4_ = auVar104._28_4_;
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_160,auVar47);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar105);
          auVar93 = vfmadd213ps_avx512vl(auVar106,local_120,auVar107);
          auVar106 = *(undefined1 (*) [32])(lVar26 + 0x21afd38 + lVar73 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x21b01bc + lVar73 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar26 + 0x21b0640 + lVar73 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar26 + 0x21b0ac4 + lVar73 * 4);
          auVar103 = vmulps_avx512vl(_local_3a0,auVar104);
          auVar94 = vmulps_avx512vl(_local_3c0,auVar104);
          auVar48._4_4_ = fVar139 * auVar104._4_4_;
          auVar48._0_4_ = fVar136 * auVar104._0_4_;
          auVar48._8_4_ = fVar82 * auVar104._8_4_;
          auVar48._12_4_ = fVar132 * auVar104._12_4_;
          auVar48._16_4_ = fVar133 * auVar104._16_4_;
          auVar48._20_4_ = fVar134 * auVar104._20_4_;
          auVar48._24_4_ = fVar135 * auVar104._24_4_;
          auVar48._28_4_ = auVar104._28_4_;
          auVar104 = vfmadd231ps_avx512vl(auVar103,auVar105,local_360);
          auVar103 = vfmadd231ps_avx512vl(auVar94,auVar105,local_380);
          auVar105 = vfmadd231ps_avx512vl(auVar48,local_160,auVar105);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_320);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_340);
          auVar107 = vfmadd231ps_avx512vl(auVar105,local_140,auVar107);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,local_2e0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_300);
          auVar94 = vfmadd231ps_avx512vl(auVar107,local_120,auVar106);
          auVar106 = *(undefined1 (*) [32])(lVar26 + 0x21b2158 + lVar73 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x21b2a60 + lVar73 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar26 + 0x21b2ee4 + lVar73 * 4);
          auVar98 = vmulps_avx512vl(_local_3a0,auVar105);
          auVar100 = vmulps_avx512vl(_local_3c0,auVar105);
          auVar105 = vmulps_avx512vl(local_180,auVar105);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_360);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_380);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_160,auVar107);
          auVar227 = ZEXT1664(auVar227._0_16_);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x21b25dc + lVar73 * 4);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_320);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_340);
          auVar107 = vfmadd231ps_avx512vl(auVar105,local_140,auVar107);
          auVar228 = ZEXT1664(auVar228._0_16_);
          auVar105 = vfmadd231ps_avx512vl(auVar98,auVar106,local_2e0);
          auVar98 = vfmadd231ps_avx512vl(auVar100,auVar106,local_300);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_120,auVar106);
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar104,auVar100);
          vandps_avx512vl(auVar103,auVar100);
          auVar106 = vmaxps_avx(auVar100,auVar100);
          vandps_avx512vl(auVar94,auVar100);
          auVar106 = vmaxps_avx(auVar106,auVar100);
          auVar67._4_4_ = uStack_3dc;
          auVar67._0_4_ = local_3e0;
          auVar67._8_4_ = uStack_3d8;
          auVar67._12_4_ = uStack_3d4;
          auVar67._16_4_ = uStack_3d0;
          auVar67._20_4_ = uStack_3cc;
          auVar67._24_4_ = uStack_3c8;
          auVar67._28_4_ = uStack_3c4;
          uVar70 = vcmpps_avx512vl(auVar106,auVar67,1);
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar119._0_4_ = (float)((uint)bVar13 * auVar97._0_4_ | (uint)!bVar13 * auVar104._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar104._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar104._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar104._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar104._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar104._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar104._24_4_)
          ;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar119._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar104._28_4_;
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar120._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar103._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar103._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar103._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar103._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar103._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar103._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar103._24_4_)
          ;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar120._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar103._28_4_;
          vandps_avx512vl(auVar105,auVar100);
          vandps_avx512vl(auVar98,auVar100);
          auVar106 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(auVar107,auVar100);
          auVar106 = vmaxps_avx(auVar106,auVar120);
          uVar70 = vcmpps_avx512vl(auVar106,auVar67,1);
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar121._0_4_ = (uint)bVar13 * auVar97._0_4_ | (uint)!bVar13 * auVar105._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar105._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar105._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar105._12_4_;
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar105._16_4_;
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar105._20_4_;
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar105._24_4_;
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar121._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar105._28_4_;
          bVar13 = (bool)((byte)uVar70 & 1);
          auVar122._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar98._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar98._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar98._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar98._12_4_);
          bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar98._16_4_);
          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar98._20_4_);
          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar98._24_4_);
          bVar13 = SUB81(uVar70 >> 7,0);
          auVar122._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar98._28_4_;
          auVar215._8_4_ = 0x80000000;
          auVar215._0_8_ = 0x8000000080000000;
          auVar215._12_4_ = 0x80000000;
          auVar215._16_4_ = 0x80000000;
          auVar215._20_4_ = 0x80000000;
          auVar215._24_4_ = 0x80000000;
          auVar215._28_4_ = 0x80000000;
          auVar106 = vxorps_avx512vl(auVar121,auVar215);
          auVar91 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
          auVar107 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar91));
          auVar20 = vfmadd231ps_fma(auVar107,auVar120,auVar120);
          auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar20));
          auVar223._8_4_ = 0xbf000000;
          auVar223._0_8_ = 0xbf000000bf000000;
          auVar223._12_4_ = 0xbf000000;
          auVar223._16_4_ = 0xbf000000;
          auVar223._20_4_ = 0xbf000000;
          auVar223._24_4_ = 0xbf000000;
          auVar223._28_4_ = 0xbf000000;
          fVar168 = auVar107._0_4_;
          fVar158 = auVar107._4_4_;
          fVar159 = auVar107._8_4_;
          fVar160 = auVar107._12_4_;
          fVar167 = auVar107._16_4_;
          fVar180 = auVar107._20_4_;
          fVar81 = auVar107._24_4_;
          auVar49._4_4_ = fVar158 * fVar158 * fVar158 * auVar20._4_4_ * -0.5;
          auVar49._0_4_ = fVar168 * fVar168 * fVar168 * auVar20._0_4_ * -0.5;
          auVar49._8_4_ = fVar159 * fVar159 * fVar159 * auVar20._8_4_ * -0.5;
          auVar49._12_4_ = fVar160 * fVar160 * fVar160 * auVar20._12_4_ * -0.5;
          auVar49._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar49._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
          auVar49._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
          auVar49._28_4_ = auVar120._28_4_;
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar107 = vfmadd231ps_avx512vl(auVar49,auVar105,auVar107);
          auVar50._4_4_ = auVar120._4_4_ * auVar107._4_4_;
          auVar50._0_4_ = auVar120._0_4_ * auVar107._0_4_;
          auVar50._8_4_ = auVar120._8_4_ * auVar107._8_4_;
          auVar50._12_4_ = auVar120._12_4_ * auVar107._12_4_;
          auVar50._16_4_ = auVar120._16_4_ * auVar107._16_4_;
          auVar50._20_4_ = auVar120._20_4_ * auVar107._20_4_;
          auVar50._24_4_ = auVar120._24_4_ * auVar107._24_4_;
          auVar50._28_4_ = 0;
          auVar51._4_4_ = auVar107._4_4_ * -auVar119._4_4_;
          auVar51._0_4_ = auVar107._0_4_ * -auVar119._0_4_;
          auVar51._8_4_ = auVar107._8_4_ * -auVar119._8_4_;
          auVar51._12_4_ = auVar107._12_4_ * -auVar119._12_4_;
          auVar51._16_4_ = auVar107._16_4_ * -auVar119._16_4_;
          auVar51._20_4_ = auVar107._20_4_ * -auVar119._20_4_;
          auVar51._24_4_ = auVar107._24_4_ * -auVar119._24_4_;
          auVar51._28_4_ = auVar120._28_4_;
          auVar104 = vmulps_avx512vl(auVar107,ZEXT1632(auVar91));
          auVar94 = ZEXT1632(auVar91);
          auVar107 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar94);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar122,auVar122);
          auVar103 = vrsqrt14ps_avx512vl(auVar107);
          auVar107 = vmulps_avx512vl(auVar107,auVar223);
          fVar168 = auVar103._0_4_;
          fVar158 = auVar103._4_4_;
          fVar159 = auVar103._8_4_;
          fVar160 = auVar103._12_4_;
          fVar167 = auVar103._16_4_;
          fVar180 = auVar103._20_4_;
          fVar81 = auVar103._24_4_;
          auVar52._4_4_ = fVar158 * fVar158 * fVar158 * auVar107._4_4_;
          auVar52._0_4_ = fVar168 * fVar168 * fVar168 * auVar107._0_4_;
          auVar52._8_4_ = fVar159 * fVar159 * fVar159 * auVar107._8_4_;
          auVar52._12_4_ = fVar160 * fVar160 * fVar160 * auVar107._12_4_;
          auVar52._16_4_ = fVar167 * fVar167 * fVar167 * auVar107._16_4_;
          auVar52._20_4_ = fVar180 * fVar180 * fVar180 * auVar107._20_4_;
          auVar52._24_4_ = fVar81 * fVar81 * fVar81 * auVar107._24_4_;
          auVar52._28_4_ = auVar107._28_4_;
          auVar107 = vfmadd231ps_avx512vl(auVar52,auVar105,auVar103);
          auVar53._4_4_ = auVar122._4_4_ * auVar107._4_4_;
          auVar53._0_4_ = auVar122._0_4_ * auVar107._0_4_;
          auVar53._8_4_ = auVar122._8_4_ * auVar107._8_4_;
          auVar53._12_4_ = auVar122._12_4_ * auVar107._12_4_;
          auVar53._16_4_ = auVar122._16_4_ * auVar107._16_4_;
          auVar53._20_4_ = auVar122._20_4_ * auVar107._20_4_;
          auVar53._24_4_ = auVar122._24_4_ * auVar107._24_4_;
          auVar53._28_4_ = auVar103._28_4_;
          auVar54._4_4_ = auVar107._4_4_ * auVar106._4_4_;
          auVar54._0_4_ = auVar107._0_4_ * auVar106._0_4_;
          auVar54._8_4_ = auVar107._8_4_ * auVar106._8_4_;
          auVar54._12_4_ = auVar107._12_4_ * auVar106._12_4_;
          auVar54._16_4_ = auVar107._16_4_ * auVar106._16_4_;
          auVar54._20_4_ = auVar107._20_4_ * auVar106._20_4_;
          auVar54._24_4_ = auVar107._24_4_ * auVar106._24_4_;
          auVar54._28_4_ = auVar106._28_4_;
          auVar106 = vmulps_avx512vl(auVar107,auVar94);
          auVar20 = vfmadd213ps_fma(auVar50,auVar95,ZEXT1632(auVar83));
          auVar21 = vfmadd213ps_fma(auVar51,auVar95,ZEXT1632(auVar84));
          auVar105 = vfmadd213ps_avx512vl(auVar104,auVar95,auVar93);
          auVar103 = vfmadd213ps_avx512vl(auVar53,auVar96,ZEXT1632(auVar88));
          auVar23 = vfnmadd213ps_fma(auVar50,auVar95,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar54,auVar96,ZEXT1632(auVar19));
          auVar24 = vfnmadd213ps_fma(auVar51,auVar95,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar106,auVar96,auVar92);
          auVar28 = vfnmadd231ps_fma(auVar93,auVar95,auVar104);
          auVar89 = vfnmadd213ps_fma(auVar53,auVar96,ZEXT1632(auVar88));
          auVar226 = vfnmadd213ps_fma(auVar54,auVar96,ZEXT1632(auVar19));
          auVar90 = vfnmadd231ps_fma(auVar92,auVar96,auVar106);
          auVar92 = vsubps_avx512vl(auVar103,ZEXT1632(auVar23));
          auVar106 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar24));
          auVar107 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar28));
          auVar55._4_4_ = auVar106._4_4_ * auVar28._4_4_;
          auVar55._0_4_ = auVar106._0_4_ * auVar28._0_4_;
          auVar55._8_4_ = auVar106._8_4_ * auVar28._8_4_;
          auVar55._12_4_ = auVar106._12_4_ * auVar28._12_4_;
          auVar55._16_4_ = auVar106._16_4_ * 0.0;
          auVar55._20_4_ = auVar106._20_4_ * 0.0;
          auVar55._24_4_ = auVar106._24_4_ * 0.0;
          auVar55._28_4_ = auVar104._28_4_;
          auVar88 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar24),auVar107);
          auVar56._4_4_ = auVar107._4_4_ * auVar23._4_4_;
          auVar56._0_4_ = auVar107._0_4_ * auVar23._0_4_;
          auVar56._8_4_ = auVar107._8_4_ * auVar23._8_4_;
          auVar56._12_4_ = auVar107._12_4_ * auVar23._12_4_;
          auVar56._16_4_ = auVar107._16_4_ * 0.0;
          auVar56._20_4_ = auVar107._20_4_ * 0.0;
          auVar56._24_4_ = auVar107._24_4_ * 0.0;
          auVar56._28_4_ = auVar107._28_4_;
          auVar19 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar28),auVar92);
          auVar57._4_4_ = auVar24._4_4_ * auVar92._4_4_;
          auVar57._0_4_ = auVar24._0_4_ * auVar92._0_4_;
          auVar57._8_4_ = auVar24._8_4_ * auVar92._8_4_;
          auVar57._12_4_ = auVar24._12_4_ * auVar92._12_4_;
          auVar57._16_4_ = auVar92._16_4_ * 0.0;
          auVar57._20_4_ = auVar92._20_4_ * 0.0;
          auVar57._24_4_ = auVar92._24_4_ * 0.0;
          auVar57._28_4_ = auVar92._28_4_;
          auVar22 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar23),auVar106);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar94,ZEXT1632(auVar19));
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar94,ZEXT1632(auVar88));
          auVar100 = ZEXT1632(auVar91);
          uVar70 = vcmpps_avx512vl(auVar106,auVar100,2);
          bVar69 = (byte)uVar70;
          fVar133 = (float)((uint)(bVar69 & 1) * auVar20._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar89._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar135 = (float)((uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar89._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar138 = (float)((uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar89._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar139 = (float)((uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar89._12_4_);
          auVar94 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar138,CONCAT44(fVar135,fVar133))));
          fVar134 = (float)((uint)(bVar69 & 1) * auVar21._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar226._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar137 = (float)((uint)bVar13 * auVar21._4_4_ | (uint)!bVar13 * auVar226._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar136 = (float)((uint)bVar13 * auVar21._8_4_ | (uint)!bVar13 * auVar226._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar140 = (float)((uint)bVar13 * auVar21._12_4_ | (uint)!bVar13 * auVar226._12_4_);
          auVar97 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar136,CONCAT44(fVar137,fVar134))));
          auVar123._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar90._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar90._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar90._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar90._12_4_)
          ;
          fVar159 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_);
          auVar123._16_4_ = fVar159;
          fVar158 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_);
          auVar123._20_4_ = fVar158;
          fVar168 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_);
          auVar123._24_4_ = fVar168;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar105._28_4_;
          auVar123._28_4_ = iVar1;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar23),auVar103);
          auVar124._0_4_ =
               (uint)(bVar69 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar88._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar88._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar88._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar88._12_4_;
          auVar124._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_;
          auVar124._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_;
          auVar124._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_;
          auVar124._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar24),ZEXT1632(auVar83));
          auVar125._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar20._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar20._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar20._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar20._12_4_)
          ;
          fVar160 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
          auVar125._16_4_ = fVar160;
          fVar167 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
          auVar125._20_4_ = fVar167;
          fVar180 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
          auVar125._24_4_ = fVar180;
          auVar125._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
          auVar106 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar84));
          auVar126._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar21._0_4_);
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar21._4_4_);
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar21._8_4_);
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar21._12_4_)
          ;
          fVar82 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar106._16_4_);
          auVar126._16_4_ = fVar82;
          fVar81 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar106._20_4_);
          auVar126._20_4_ = fVar81;
          fVar132 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar106._24_4_);
          auVar126._24_4_ = fVar132;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar106._28_4_;
          auVar126._28_4_ = iVar2;
          auVar127._0_4_ =
               (uint)(bVar69 & 1) * (int)auVar23._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar103._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar13 * (int)auVar23._4_4_ | (uint)!bVar13 * auVar103._4_4_;
          bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar13 * (int)auVar23._8_4_ | (uint)!bVar13 * auVar103._8_4_;
          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar13 * (int)auVar23._12_4_ | (uint)!bVar13 * auVar103._12_4_;
          auVar127._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar103._16_4_;
          auVar127._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar103._20_4_;
          auVar127._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar103._24_4_;
          auVar127._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar103._28_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar103 = vsubps_avx512vl(auVar127,auVar94);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar24._12_4_ |
                                                   (uint)!bVar17 * auVar83._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar24._8_4_ |
                                                            (uint)!bVar15 * auVar83._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar24._4_4_ |
                                                                     (uint)!bVar13 * auVar83._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar24._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar83._0_4_)))),auVar97);
          auVar205 = ZEXT3264(auVar107);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar28._12_4_ |
                                                   (uint)!bVar18 * auVar84._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar28._8_4_ |
                                                            (uint)!bVar16 * auVar84._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar28._4_4_ |
                                                                     (uint)!bVar14 * auVar84._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar28._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar84._0_4_)))),auVar123);
          auVar104 = vsubps_avx(auVar94,auVar124);
          auVar210 = ZEXT3264(auVar104);
          auVar92 = vsubps_avx(auVar97,auVar125);
          auVar93 = vsubps_avx(auVar123,auVar126);
          auVar58._4_4_ = auVar105._4_4_ * fVar135;
          auVar58._0_4_ = auVar105._0_4_ * fVar133;
          auVar58._8_4_ = auVar105._8_4_ * fVar138;
          auVar58._12_4_ = auVar105._12_4_ * fVar139;
          auVar58._16_4_ = auVar105._16_4_ * 0.0;
          auVar58._20_4_ = auVar105._20_4_ * 0.0;
          auVar58._24_4_ = auVar105._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar58,auVar123,auVar103);
          auVar185._0_4_ = fVar134 * auVar103._0_4_;
          auVar185._4_4_ = fVar137 * auVar103._4_4_;
          auVar185._8_4_ = fVar136 * auVar103._8_4_;
          auVar185._12_4_ = fVar140 * auVar103._12_4_;
          auVar185._16_4_ = auVar103._16_4_ * 0.0;
          auVar185._20_4_ = auVar103._20_4_ * 0.0;
          auVar185._24_4_ = auVar103._24_4_ * 0.0;
          auVar185._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar185,auVar94,auVar107);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar100,ZEXT1632(auVar83));
          auVar199._0_4_ = auVar107._0_4_ * auVar123._0_4_;
          auVar199._4_4_ = auVar107._4_4_ * auVar123._4_4_;
          auVar199._8_4_ = auVar107._8_4_ * auVar123._8_4_;
          auVar199._12_4_ = auVar107._12_4_ * auVar123._12_4_;
          auVar199._16_4_ = auVar107._16_4_ * fVar159;
          auVar199._20_4_ = auVar107._20_4_ * fVar158;
          auVar199._24_4_ = auVar107._24_4_ * fVar168;
          auVar199._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar199,auVar97,auVar105);
          auVar98 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar83));
          auVar106 = vmulps_avx512vl(auVar93,auVar124);
          auVar106 = vfmsub231ps_avx512vl(auVar106,auVar104,auVar126);
          auVar59._4_4_ = auVar92._4_4_ * auVar126._4_4_;
          auVar59._0_4_ = auVar92._0_4_ * auVar126._0_4_;
          auVar59._8_4_ = auVar92._8_4_ * auVar126._8_4_;
          auVar59._12_4_ = auVar92._12_4_ * auVar126._12_4_;
          auVar59._16_4_ = auVar92._16_4_ * fVar82;
          auVar59._20_4_ = auVar92._20_4_ * fVar81;
          auVar59._24_4_ = auVar92._24_4_ * fVar132;
          auVar59._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar59,auVar125,auVar93);
          auVar200._0_4_ = auVar125._0_4_ * auVar104._0_4_;
          auVar200._4_4_ = auVar125._4_4_ * auVar104._4_4_;
          auVar200._8_4_ = auVar125._8_4_ * auVar104._8_4_;
          auVar200._12_4_ = auVar125._12_4_ * auVar104._12_4_;
          auVar200._16_4_ = fVar160 * auVar104._16_4_;
          auVar200._20_4_ = fVar167 * auVar104._20_4_;
          auVar200._24_4_ = fVar180 * auVar104._24_4_;
          auVar200._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar200,auVar92,auVar124);
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar100,auVar106);
          auVar99 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar83));
          auVar201 = ZEXT3264(auVar99);
          auVar106 = vmaxps_avx(auVar98,auVar99);
          uVar161 = vcmpps_avx512vl(auVar106,auVar100,2);
          bVar78 = bVar78 & (byte)uVar161;
          if (bVar78 != 0) {
            uVar141 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar224._4_4_ = uVar141;
            auVar224._0_4_ = uVar141;
            auVar224._8_4_ = uVar141;
            auVar224._12_4_ = uVar141;
            auVar224._16_4_ = uVar141;
            auVar224._20_4_ = uVar141;
            auVar224._24_4_ = uVar141;
            auVar224._28_4_ = uVar141;
            auVar225 = ZEXT3264(auVar224);
            auVar60._4_4_ = auVar93._4_4_ * auVar107._4_4_;
            auVar60._0_4_ = auVar93._0_4_ * auVar107._0_4_;
            auVar60._8_4_ = auVar93._8_4_ * auVar107._8_4_;
            auVar60._12_4_ = auVar93._12_4_ * auVar107._12_4_;
            auVar60._16_4_ = auVar93._16_4_ * auVar107._16_4_;
            auVar60._20_4_ = auVar93._20_4_ * auVar107._20_4_;
            auVar60._24_4_ = auVar93._24_4_ * auVar107._24_4_;
            auVar60._28_4_ = auVar106._28_4_;
            auVar19 = vfmsub231ps_fma(auVar60,auVar92,auVar105);
            auVar61._4_4_ = auVar105._4_4_ * auVar104._4_4_;
            auVar61._0_4_ = auVar105._0_4_ * auVar104._0_4_;
            auVar61._8_4_ = auVar105._8_4_ * auVar104._8_4_;
            auVar61._12_4_ = auVar105._12_4_ * auVar104._12_4_;
            auVar61._16_4_ = auVar105._16_4_ * auVar104._16_4_;
            auVar61._20_4_ = auVar105._20_4_ * auVar104._20_4_;
            auVar61._24_4_ = auVar105._24_4_ * auVar104._24_4_;
            auVar61._28_4_ = auVar105._28_4_;
            auVar88 = vfmsub231ps_fma(auVar61,auVar103,auVar93);
            auVar62._4_4_ = auVar92._4_4_ * auVar103._4_4_;
            auVar62._0_4_ = auVar92._0_4_ * auVar103._0_4_;
            auVar62._8_4_ = auVar92._8_4_ * auVar103._8_4_;
            auVar62._12_4_ = auVar92._12_4_ * auVar103._12_4_;
            auVar62._16_4_ = auVar92._16_4_ * auVar103._16_4_;
            auVar62._20_4_ = auVar92._20_4_ * auVar103._20_4_;
            auVar62._24_4_ = auVar92._24_4_ * auVar103._24_4_;
            auVar62._28_4_ = auVar92._28_4_;
            auVar20 = vfmsub231ps_fma(auVar62,auVar104,auVar107);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar20));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar19),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar106 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
            auVar37._8_4_ = 0x3f800000;
            auVar37._0_8_ = 0x3f8000003f800000;
            auVar37._12_4_ = 0x3f800000;
            auVar37._16_4_ = 0x3f800000;
            auVar37._20_4_ = 0x3f800000;
            auVar37._24_4_ = 0x3f800000;
            auVar37._28_4_ = 0x3f800000;
            auVar107 = vfnmadd213ps_avx512vl(auVar106,ZEXT1632(auVar84),auVar37);
            auVar83 = vfmadd132ps_fma(auVar107,auVar106,auVar106);
            auVar205 = ZEXT1664(auVar83);
            auVar63._4_4_ = auVar20._4_4_ * auVar123._4_4_;
            auVar63._0_4_ = auVar20._0_4_ * auVar123._0_4_;
            auVar63._8_4_ = auVar20._8_4_ * auVar123._8_4_;
            auVar63._12_4_ = auVar20._12_4_ * auVar123._12_4_;
            auVar63._16_4_ = fVar159 * 0.0;
            auVar63._20_4_ = fVar158 * 0.0;
            auVar63._24_4_ = fVar168 * 0.0;
            auVar63._28_4_ = iVar1;
            auVar88 = vfmadd231ps_fma(auVar63,auVar97,ZEXT1632(auVar88));
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar94,ZEXT1632(auVar19));
            fVar168 = auVar83._0_4_;
            fVar158 = auVar83._4_4_;
            fVar159 = auVar83._8_4_;
            fVar160 = auVar83._12_4_;
            local_520._28_4_ = auVar106._28_4_;
            local_520._0_28_ =
                 ZEXT1628(CONCAT412(auVar88._12_4_ * fVar160,
                                    CONCAT48(auVar88._8_4_ * fVar159,
                                             CONCAT44(auVar88._4_4_ * fVar158,
                                                      auVar88._0_4_ * fVar168))));
            auVar210 = ZEXT3264(local_520);
            uVar161 = vcmpps_avx512vl(local_520,auVar224,2);
            auVar66._4_4_ = uStack_49c;
            auVar66._0_4_ = local_4a0;
            auVar66._8_4_ = uStack_498;
            auVar66._12_4_ = uStack_494;
            auVar66._16_4_ = uStack_490;
            auVar66._20_4_ = uStack_48c;
            auVar66._24_4_ = uStack_488;
            auVar66._28_4_ = uStack_484;
            uVar25 = vcmpps_avx512vl(local_520,auVar66,0xd);
            bVar78 = (byte)uVar161 & (byte)uVar25 & bVar78;
            if (bVar78 != 0) {
              uVar79 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar79 = bVar78 & uVar79;
              if ((char)uVar79 != '\0') {
                fVar167 = auVar98._0_4_ * fVar168;
                fVar180 = auVar98._4_4_ * fVar158;
                auVar64._4_4_ = fVar180;
                auVar64._0_4_ = fVar167;
                fVar81 = auVar98._8_4_ * fVar159;
                auVar64._8_4_ = fVar81;
                fVar82 = auVar98._12_4_ * fVar160;
                auVar64._12_4_ = fVar82;
                fVar132 = auVar98._16_4_ * 0.0;
                auVar64._16_4_ = fVar132;
                fVar133 = auVar98._20_4_ * 0.0;
                auVar64._20_4_ = fVar133;
                fVar134 = auVar98._24_4_ * 0.0;
                auVar64._24_4_ = fVar134;
                auVar64._28_4_ = auVar98._28_4_;
                auVar179._8_4_ = 0x3f800000;
                auVar179._0_8_ = 0x3f8000003f800000;
                auVar179._12_4_ = 0x3f800000;
                auVar179._16_4_ = 0x3f800000;
                auVar179._20_4_ = 0x3f800000;
                auVar179._24_4_ = 0x3f800000;
                auVar179._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar179,auVar64);
                local_2c0._0_4_ =
                     (float)((uint)(bVar69 & 1) * (int)fVar167 |
                            (uint)!(bool)(bVar69 & 1) * auVar106._0_4_);
                bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar180 | (uint)!bVar13 * auVar106._4_4_);
                bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar81 | (uint)!bVar13 * auVar106._8_4_);
                bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar82 | (uint)!bVar13 * auVar106._12_4_);
                bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar132 | (uint)!bVar13 * auVar106._16_4_);
                bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar133 | (uint)!bVar13 * auVar106._20_4_);
                bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar134 | (uint)!bVar13 * auVar106._24_4_);
                bVar13 = SUB81(uVar70 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar13 * auVar98._28_4_ | (uint)!bVar13 * auVar106._28_4_);
                auVar106 = vsubps_avx(auVar96,auVar95);
                auVar83 = vfmadd213ps_fma(auVar106,local_2c0,auVar95);
                uVar141 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
                auVar38._4_4_ = uVar141;
                auVar38._0_4_ = uVar141;
                auVar38._8_4_ = uVar141;
                auVar38._12_4_ = uVar141;
                auVar38._16_4_ = uVar141;
                auVar38._20_4_ = uVar141;
                auVar38._24_4_ = uVar141;
                auVar38._28_4_ = uVar141;
                auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                              CONCAT48(auVar83._8_4_ + auVar83._8_4_
                                                                       ,CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                           auVar38);
                uVar80 = vcmpps_avx512vl(local_520,auVar106,6);
                uVar79 = uVar79 & uVar80;
                bVar78 = (byte)uVar79;
                if (bVar78 != 0) {
                  auVar166._0_4_ = auVar99._0_4_ * fVar168;
                  auVar166._4_4_ = auVar99._4_4_ * fVar158;
                  auVar166._8_4_ = auVar99._8_4_ * fVar159;
                  auVar166._12_4_ = auVar99._12_4_ * fVar160;
                  auVar166._16_4_ = auVar99._16_4_ * 0.0;
                  auVar166._20_4_ = auVar99._20_4_ * 0.0;
                  auVar166._24_4_ = auVar99._24_4_ * 0.0;
                  auVar166._28_4_ = 0;
                  auVar186._8_4_ = 0x3f800000;
                  auVar186._0_8_ = 0x3f8000003f800000;
                  auVar186._12_4_ = 0x3f800000;
                  auVar186._16_4_ = 0x3f800000;
                  auVar186._20_4_ = 0x3f800000;
                  auVar186._24_4_ = 0x3f800000;
                  auVar186._28_4_ = 0x3f800000;
                  auVar106 = vsubps_avx(auVar186,auVar166);
                  auVar128._0_4_ =
                       (uint)(bVar69 & 1) * (int)auVar166._0_4_ |
                       (uint)!(bool)(bVar69 & 1) * auVar106._0_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar128._4_4_ =
                       (uint)bVar13 * (int)auVar166._4_4_ | (uint)!bVar13 * auVar106._4_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar128._8_4_ =
                       (uint)bVar13 * (int)auVar166._8_4_ | (uint)!bVar13 * auVar106._8_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar128._12_4_ =
                       (uint)bVar13 * (int)auVar166._12_4_ | (uint)!bVar13 * auVar106._12_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar128._16_4_ =
                       (uint)bVar13 * (int)auVar166._16_4_ | (uint)!bVar13 * auVar106._16_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar128._20_4_ =
                       (uint)bVar13 * (int)auVar166._20_4_ | (uint)!bVar13 * auVar106._20_4_;
                  bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar128._24_4_ =
                       (uint)bVar13 * (int)auVar166._24_4_ | (uint)!bVar13 * auVar106._24_4_;
                  auVar128._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar106._28_4_;
                  auVar39._8_4_ = 0x40000000;
                  auVar39._0_8_ = 0x4000000040000000;
                  auVar39._12_4_ = 0x40000000;
                  auVar39._16_4_ = 0x40000000;
                  auVar39._20_4_ = 0x40000000;
                  auVar39._24_4_ = 0x40000000;
                  auVar39._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar128,auVar186,auVar39);
                  local_280 = local_520;
                  local_260 = (int)lVar73;
                  local_25c = iVar8;
                  local_250 = local_5a0._0_8_;
                  uStack_248 = local_5a0._8_8_;
                  local_240 = local_5b0._0_8_;
                  uStack_238 = local_5b0._8_8_;
                  local_230 = local_5c0._0_8_;
                  uStack_228 = local_5c0._8_8_;
                  local_220 = local_5d0;
                  uStack_218 = uStack_5c8;
                  pGVar75 = (context->scene->geometries).items[uVar76].ptr;
                  if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar83 = vcvtsi2ss_avx512f(auVar91,(int)lVar73);
                    fVar168 = auVar83._0_4_;
                    local_200[0] = (fVar168 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar168 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar168 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar168 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar168 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar168 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar168 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar168 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_520;
                    auVar153._8_4_ = 0x7f800000;
                    auVar153._0_8_ = 0x7f8000007f800000;
                    auVar153._12_4_ = 0x7f800000;
                    auVar153._16_4_ = 0x7f800000;
                    auVar153._20_4_ = 0x7f800000;
                    auVar153._24_4_ = 0x7f800000;
                    auVar153._28_4_ = 0x7f800000;
                    auVar106 = vblendmps_avx512vl(auVar153,local_520);
                    auVar129._0_4_ =
                         (uint)(bVar78 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 1) & 1);
                    auVar129._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 2) & 1);
                    auVar129._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 3) & 1);
                    auVar129._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 4) & 1);
                    auVar129._16_4_ = (uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 5) & 1);
                    auVar129._20_4_ = (uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar79 >> 6) & 1);
                    auVar129._24_4_ = (uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar79 >> 7,0);
                    auVar129._28_4_ = (uint)bVar13 * auVar106._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar106 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar106 = vminps_avx(auVar129,auVar106);
                    auVar107 = vshufpd_avx(auVar106,auVar106,5);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    auVar107 = vpermpd_avx2(auVar106,0x4e);
                    auVar106 = vminps_avx(auVar106,auVar107);
                    uVar161 = vcmpps_avx512vl(auVar129,auVar106,0);
                    uVar71 = (uint)uVar79;
                    if (((byte)uVar161 & bVar78) != 0) {
                      uVar71 = (uint)((byte)uVar161 & bVar78);
                    }
                    uVar72 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar70 = (ulong)uVar72;
                    pGVar68 = pGVar75;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_558 = pGVar68;
                        fVar168 = local_200[uVar70];
                        local_440._4_4_ = fVar168;
                        local_440._0_4_ = fVar168;
                        local_440._8_4_ = fVar168;
                        local_440._12_4_ = fVar168;
                        local_430 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar70 * 4);
                        local_588.context = context->user;
                        fVar158 = 1.0 - fVar168;
                        auVar33._8_4_ = 0x80000000;
                        auVar33._0_8_ = 0x8000000080000000;
                        auVar33._12_4_ = 0x80000000;
                        auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar158),auVar33);
                        auVar83 = ZEXT416((uint)(fVar168 * fVar158 * 4.0));
                        auVar84 = vfnmsub213ss_fma(local_440,local_440,auVar83);
                        auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),
                                                  auVar83);
                        fVar158 = fVar158 * auVar88._0_4_ * 0.5;
                        fVar159 = auVar84._0_4_ * 0.5;
                        auVar205 = ZEXT464((uint)fVar159);
                        fVar160 = auVar83._0_4_ * 0.5;
                        fVar168 = fVar168 * fVar168 * 0.5;
                        auVar193._0_4_ = fVar168 * (float)local_5d0._0_4_;
                        auVar193._4_4_ = fVar168 * (float)local_5d0._4_4_;
                        auVar193._8_4_ = fVar168 * (float)uStack_5c8;
                        auVar193._12_4_ = fVar168 * uStack_5c8._4_4_;
                        auVar146._4_4_ = fVar160;
                        auVar146._0_4_ = fVar160;
                        auVar146._8_4_ = fVar160;
                        auVar146._12_4_ = fVar160;
                        auVar83 = vfmadd132ps_fma(auVar146,auVar193,local_5c0);
                        auVar194._4_4_ = fVar159;
                        auVar194._0_4_ = fVar159;
                        auVar194._8_4_ = fVar159;
                        auVar194._12_4_ = fVar159;
                        auVar83 = vfmadd132ps_fma(auVar194,auVar83,local_5b0);
                        auVar147._4_4_ = fVar158;
                        auVar147._0_4_ = fVar158;
                        auVar147._8_4_ = fVar158;
                        auVar147._12_4_ = fVar158;
                        auVar83 = vfmadd132ps_fma(auVar147,auVar83,local_5a0);
                        local_470 = auVar83._0_4_;
                        local_460 = vshufps_avx(auVar83,auVar83,0x55);
                        auVar201 = ZEXT1664(local_460);
                        local_450 = vshufps_avx(auVar83,auVar83,0xaa);
                        iStack_46c = local_470;
                        iStack_468 = local_470;
                        iStack_464 = local_470;
                        uStack_42c = local_430;
                        uStack_428 = local_430;
                        uStack_424 = local_430;
                        local_420 = local_540._0_8_;
                        uStack_418 = local_540._8_8_;
                        local_410 = local_550;
                        vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                        uStack_3fc = (local_588.context)->instID[0];
                        local_400 = uStack_3fc;
                        uStack_3f8 = uStack_3fc;
                        uStack_3f4 = uStack_3fc;
                        uStack_3f0 = (local_588.context)->instPrimID[0];
                        uStack_3ec = uStack_3f0;
                        uStack_3e8 = uStack_3f0;
                        uStack_3e4 = uStack_3f0;
                        local_5f0 = local_4d0;
                        local_588.valid = (int *)local_5f0;
                        local_588.geometryUserPtr = pGVar75->userPtr;
                        local_588.hit = (RTCHitN *)&local_470;
                        local_588.N = 4;
                        local_500 = auVar225._0_32_;
                        local_588.ray = (RTCRayN *)ray;
                        if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar201 = ZEXT1664(local_460);
                          auVar205 = ZEXT464((uint)fVar159);
                          (*pGVar75->intersectionFilterN)(&local_588);
                          auVar210 = ZEXT3264(local_520);
                          auVar225 = ZEXT3264(local_500);
                          pGVar75 = local_558;
                        }
                        uVar80 = vptestmd_avx512vl(local_5f0,local_5f0);
                        if ((uVar80 & 0xf) == 0) {
LAB_01bb531b:
                          *(int *)(ray + k * 4 + 0x80) = auVar225._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar201 = ZEXT1664(auVar201._0_16_);
                            auVar205 = ZEXT1664(auVar205._0_16_);
                            (*p_Var12)(&local_588);
                            auVar210 = ZEXT3264(local_520);
                            auVar225 = ZEXT3264(local_500);
                            pGVar75 = local_558;
                          }
                          uVar80 = vptestmd_avx512vl(local_5f0,local_5f0);
                          uVar80 = uVar80 & 0xf;
                          bVar78 = (byte)uVar80;
                          if (bVar78 == 0) goto LAB_01bb531b;
                          iVar1 = *(int *)(local_588.hit + 4);
                          iVar2 = *(int *)(local_588.hit + 8);
                          iVar65 = *(int *)(local_588.hit + 0xc);
                          bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar15 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_588.ray + 0xc0) =
                               (uint)(bVar78 & 1) * *(int *)local_588.hit |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xc0);
                          *(uint *)(local_588.ray + 0xc4) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xc4)
                          ;
                          *(uint *)(local_588.ray + 200) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 200);
                          *(uint *)(local_588.ray + 0xcc) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_588.ray + 0xcc);
                          iVar1 = *(int *)(local_588.hit + 0x14);
                          iVar2 = *(int *)(local_588.hit + 0x18);
                          iVar65 = *(int *)(local_588.hit + 0x1c);
                          bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar15 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_588.ray + 0xd0) =
                               (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x10) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xd0);
                          *(uint *)(local_588.ray + 0xd4) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xd4)
                          ;
                          *(uint *)(local_588.ray + 0xd8) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 0xd8)
                          ;
                          *(uint *)(local_588.ray + 0xdc) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_588.ray + 0xdc);
                          iVar1 = *(int *)(local_588.hit + 0x24);
                          iVar2 = *(int *)(local_588.hit + 0x28);
                          iVar65 = *(int *)(local_588.hit + 0x2c);
                          bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar15 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_588.ray + 0xe0) =
                               (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x20) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xe0);
                          *(uint *)(local_588.ray + 0xe4) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xe4)
                          ;
                          *(uint *)(local_588.ray + 0xe8) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 0xe8)
                          ;
                          *(uint *)(local_588.ray + 0xec) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_588.ray + 0xec);
                          iVar1 = *(int *)(local_588.hit + 0x34);
                          iVar2 = *(int *)(local_588.hit + 0x38);
                          iVar65 = *(int *)(local_588.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar15 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_588.ray + 0xf0) =
                               (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x30) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0xf0);
                          *(uint *)(local_588.ray + 0xf4) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_588.ray + 0xf4)
                          ;
                          *(uint *)(local_588.ray + 0xf8) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_588.ray + 0xf8)
                          ;
                          *(uint *)(local_588.ray + 0xfc) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_588.ray + 0xfc);
                          iVar1 = *(int *)(local_588.hit + 0x44);
                          iVar2 = *(int *)(local_588.hit + 0x48);
                          iVar65 = *(int *)(local_588.hit + 0x4c);
                          bVar13 = (bool)((byte)(uVar80 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar80 >> 2) & 1);
                          bVar15 = SUB81(uVar80 >> 3,0);
                          *(uint *)(local_588.ray + 0x100) =
                               (uint)(bVar78 & 1) * *(int *)(local_588.hit + 0x40) |
                               (uint)!(bool)(bVar78 & 1) * *(int *)(local_588.ray + 0x100);
                          *(uint *)(local_588.ray + 0x104) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_588.ray + 0x104);
                          *(uint *)(local_588.ray + 0x108) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_588.ray + 0x108);
                          *(uint *)(local_588.ray + 0x10c) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_588.ray + 0x10c);
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x110) = auVar83;
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x120) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x130) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x140) = auVar83;
                          auVar225 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                        }
                        bVar78 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar79;
                        uVar141 = auVar225._0_4_;
                        auVar154._4_4_ = uVar141;
                        auVar154._0_4_ = uVar141;
                        auVar154._8_4_ = uVar141;
                        auVar154._12_4_ = uVar141;
                        auVar154._16_4_ = uVar141;
                        auVar154._20_4_ = uVar141;
                        auVar154._24_4_ = uVar141;
                        auVar154._28_4_ = uVar141;
                        uVar161 = vcmpps_avx512vl(auVar210._0_32_,auVar154,2);
                        if ((bVar78 & (byte)uVar161) == 0) goto LAB_01bb53aa;
                        bVar78 = bVar78 & (byte)uVar161;
                        uVar79 = (ulong)bVar78;
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar106 = vblendmps_avx512vl(auVar155,auVar210._0_32_);
                        auVar130._0_4_ =
                             (uint)(bVar78 & 1) * auVar106._0_4_ |
                             (uint)!(bool)(bVar78 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 1 & 1);
                        auVar130._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 2 & 1);
                        auVar130._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 3 & 1);
                        auVar130._12_4_ =
                             (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 4 & 1);
                        auVar130._16_4_ =
                             (uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 5 & 1);
                        auVar130._20_4_ =
                             (uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar78 >> 6 & 1);
                        auVar130._24_4_ =
                             (uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar130._28_4_ =
                             (uint)(bVar78 >> 7) * auVar106._28_4_ |
                             (uint)!(bool)(bVar78 >> 7) * 0x7f800000;
                        auVar106 = vshufps_avx(auVar130,auVar130,0xb1);
                        auVar106 = vminps_avx(auVar130,auVar106);
                        auVar107 = vshufpd_avx(auVar106,auVar106,5);
                        auVar106 = vminps_avx(auVar106,auVar107);
                        auVar107 = vpermpd_avx2(auVar106,0x4e);
                        auVar106 = vminps_avx(auVar106,auVar107);
                        uVar161 = vcmpps_avx512vl(auVar130,auVar106,0);
                        bVar69 = (byte)uVar161 & bVar78;
                        if (bVar69 != 0) {
                          bVar78 = bVar69;
                        }
                        uVar71 = 0;
                        for (uVar72 = (uint)bVar78; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar70 = (ulong)uVar71;
                        pGVar68 = local_558;
                      } while( true );
                    }
                    fVar168 = local_200[uVar70];
                    uVar141 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                    fVar158 = 1.0 - fVar168;
                    auVar32._8_4_ = 0x80000000;
                    auVar32._0_8_ = 0x8000000080000000;
                    auVar32._12_4_ = 0x80000000;
                    auVar88 = vxorps_avx512vl(ZEXT416((uint)fVar158),auVar32);
                    auVar83 = ZEXT416((uint)(fVar168 * fVar158 * 4.0));
                    auVar84 = vfnmsub213ss_fma(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),auVar83
                                              );
                    auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),auVar83)
                    ;
                    fVar158 = fVar158 * auVar88._0_4_ * 0.5;
                    fVar159 = auVar84._0_4_ * 0.5;
                    auVar205 = ZEXT464((uint)fVar159);
                    fVar160 = auVar83._0_4_ * 0.5;
                    fVar167 = fVar168 * fVar168 * 0.5;
                    auVar191._0_4_ = fVar167 * (float)local_5d0._0_4_;
                    auVar191._4_4_ = fVar167 * (float)local_5d0._4_4_;
                    auVar191._8_4_ = fVar167 * (float)uStack_5c8;
                    auVar191._12_4_ = fVar167 * uStack_5c8._4_4_;
                    auVar176._4_4_ = fVar160;
                    auVar176._0_4_ = fVar160;
                    auVar176._8_4_ = fVar160;
                    auVar176._12_4_ = fVar160;
                    auVar83 = vfmadd132ps_fma(auVar176,auVar191,local_5c0);
                    auVar192._4_4_ = fVar159;
                    auVar192._0_4_ = fVar159;
                    auVar192._8_4_ = fVar159;
                    auVar192._12_4_ = fVar159;
                    auVar83 = vfmadd132ps_fma(auVar192,auVar83,local_5b0);
                    auVar201 = ZEXT1664(auVar83);
                    auVar177._4_4_ = fVar158;
                    auVar177._0_4_ = fVar158;
                    auVar177._8_4_ = fVar158;
                    auVar177._12_4_ = fVar158;
                    auVar83 = vfmadd132ps_fma(auVar177,auVar83,local_5a0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar70 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                    uVar9 = vextractps_avx(auVar83,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                    uVar9 = vextractps_avx(auVar83,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar9;
                    *(float *)(ray + k * 4 + 0xf0) = fVar168;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar141;
                    *(uint *)(ray + k * 4 + 0x110) = uVar7;
                    *(uint *)(ray + k * 4 + 0x120) = uVar76;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01bb5019;
      }
LAB_01bb4685:
      uVar141 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31._4_4_ = uVar141;
      auVar31._0_4_ = uVar141;
      auVar31._8_4_ = uVar141;
      auVar31._12_4_ = uVar141;
      uVar161 = vcmpps_avx512vl(local_190,auVar31,2);
      uVar76 = (uint)uVar77 & (uint)uVar77 + 0xf & (uint)uVar161;
      uVar77 = (ulong)uVar76;
    } while (uVar76 != 0);
  }
  return;
LAB_01bb53aa:
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar83);
  auVar228 = ZEXT464(0xbf800000);
LAB_01bb5019:
  lVar73 = lVar73 + 8;
  if (iVar8 <= (int)lVar73) goto LAB_01bb4685;
  goto LAB_01bb4736;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }